

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  BBox1f BVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  LinearSpace3fa *pLVar47;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  bool bVar55;
  ulong uVar56;
  bool bVar57;
  float fVar58;
  undefined4 uVar59;
  float fVar60;
  float fVar82;
  float fVar84;
  vint4 bi_2;
  undefined1 auVar61 [16];
  float fVar86;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar83;
  float fVar85;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined8 uVar87;
  vint4 bi_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  vint4 ai_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar133;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  float fVar145;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar180;
  float fVar181;
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar193;
  float fVar194;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar187 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar195;
  undefined1 auVar192 [32];
  float fVar199;
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar211;
  float fVar227;
  vfloat4 a0_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  vfloat4 a0_3;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  vfloat4 a0_1;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar249 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar258;
  float fVar268;
  float fVar269;
  vfloat4 a0;
  undefined1 auVar259 [16];
  float fVar270;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar282 [32];
  undefined1 local_658 [8];
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  vfloat_impl<4> p00;
  undefined1 local_578 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_538 [16];
  undefined1 (*local_520) [16];
  LinearSpace3fa *local_518;
  ulong local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  uint local_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar281 [32];
  
  PVar3 = prim[1];
  uVar49 = (ulong)(byte)PVar3;
  fVar58 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar61._0_4_ = fVar58 * auVar9._0_4_;
  auVar61._4_4_ = fVar58 * auVar9._4_4_;
  auVar61._8_4_ = fVar58 * auVar9._8_4_;
  auVar61._12_4_ = fVar58 * auVar9._12_4_;
  auVar146._0_4_ = fVar58 * auVar10._0_4_;
  auVar146._4_4_ = fVar58 * auVar10._4_4_;
  auVar146._8_4_ = fVar58 * auVar10._8_4_;
  auVar146._12_4_ = fVar58 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xc + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xd + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x13 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x14 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar250._4_4_ = auVar146._0_4_;
  auVar250._0_4_ = auVar146._0_4_;
  auVar250._8_4_ = auVar146._0_4_;
  auVar250._12_4_ = auVar146._0_4_;
  auVar89 = vshufps_avx(auVar146,auVar146,0x55);
  auVar62 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar58 = auVar62._0_4_;
  auVar229._0_4_ = fVar58 * auVar12._0_4_;
  fVar82 = auVar62._4_4_;
  auVar229._4_4_ = fVar82 * auVar12._4_4_;
  fVar84 = auVar62._8_4_;
  auVar229._8_4_ = fVar84 * auVar12._8_4_;
  fVar86 = auVar62._12_4_;
  auVar229._12_4_ = fVar86 * auVar12._12_4_;
  auVar212._0_4_ = auVar15._0_4_ * fVar58;
  auVar212._4_4_ = auVar15._4_4_ * fVar82;
  auVar212._8_4_ = auVar15._8_4_ * fVar84;
  auVar212._12_4_ = auVar15._12_4_ * fVar86;
  auVar183._0_4_ = auVar109._0_4_ * fVar58;
  auVar183._4_4_ = auVar109._4_4_ * fVar82;
  auVar183._8_4_ = auVar109._8_4_ * fVar84;
  auVar183._12_4_ = auVar109._12_4_ * fVar86;
  auVar62 = vfmadd231ps_fma(auVar229,auVar89,auVar10);
  auVar90 = vfmadd231ps_fma(auVar212,auVar89,auVar14);
  auVar89 = vfmadd231ps_fma(auVar183,auVar63,auVar89);
  auVar122 = vfmadd231ps_fma(auVar62,auVar250,auVar9);
  auVar90 = vfmadd231ps_fma(auVar90,auVar250,auVar13);
  auVar136 = vfmadd231ps_fma(auVar89,auVar64,auVar250);
  auVar154._4_4_ = auVar61._0_4_;
  auVar154._0_4_ = auVar61._0_4_;
  auVar154._8_4_ = auVar61._0_4_;
  auVar154._12_4_ = auVar61._0_4_;
  auVar89 = vshufps_avx(auVar61,auVar61,0x55);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar58 = auVar62._0_4_;
  auVar147._0_4_ = fVar58 * auVar12._0_4_;
  fVar82 = auVar62._4_4_;
  auVar147._4_4_ = fVar82 * auVar12._4_4_;
  fVar84 = auVar62._8_4_;
  auVar147._8_4_ = fVar84 * auVar12._8_4_;
  fVar86 = auVar62._12_4_;
  auVar147._12_4_ = fVar86 * auVar12._12_4_;
  auVar88._0_4_ = auVar15._0_4_ * fVar58;
  auVar88._4_4_ = auVar15._4_4_ * fVar82;
  auVar88._8_4_ = auVar15._8_4_ * fVar84;
  auVar88._12_4_ = auVar15._12_4_ * fVar86;
  auVar62._0_4_ = auVar109._0_4_ * fVar58;
  auVar62._4_4_ = auVar109._4_4_ * fVar82;
  auVar62._8_4_ = auVar109._8_4_ * fVar84;
  auVar62._12_4_ = auVar109._12_4_ * fVar86;
  auVar10 = vfmadd231ps_fma(auVar147,auVar89,auVar10);
  auVar12 = vfmadd231ps_fma(auVar88,auVar89,auVar14);
  auVar14 = vfmadd231ps_fma(auVar62,auVar89,auVar63);
  auVar15 = vfmadd231ps_fma(auVar10,auVar154,auVar9);
  auVar63 = vfmadd231ps_fma(auVar12,auVar154,auVar13);
  local_428._8_4_ = 0x7fffffff;
  local_428._0_8_ = 0x7fffffff7fffffff;
  local_428._12_4_ = 0x7fffffff;
  auVar109 = vfmadd231ps_fma(auVar14,auVar154,auVar64);
  auVar9 = vandps_avx(auVar122,local_428);
  auVar135._8_4_ = 0x219392ef;
  auVar135._0_8_ = 0x219392ef219392ef;
  auVar135._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar135,1);
  auVar10 = vblendvps_avx(auVar122,auVar135,auVar9);
  auVar9 = vandps_avx(auVar90,local_428);
  auVar9 = vcmpps_avx(auVar9,auVar135,1);
  auVar12 = vblendvps_avx(auVar90,auVar135,auVar9);
  auVar9 = vandps_avx(local_428,auVar136);
  auVar9 = vcmpps_avx(auVar9,auVar135,1);
  auVar9 = vblendvps_avx(auVar136,auVar135,auVar9);
  auVar13 = vrcpps_avx(auVar10);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar13,auVar184);
  auVar13 = vfmadd132ps_fma(auVar10,auVar13,auVar13);
  auVar10 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar184);
  auVar14 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar184);
  auVar64 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar12 = vsubps_avx(auVar9,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar136._0_4_ = auVar13._0_4_ * auVar12._0_4_;
  auVar136._4_4_ = auVar13._4_4_ * auVar12._4_4_;
  auVar136._8_4_ = auVar13._8_4_ * auVar12._8_4_;
  auVar136._12_4_ = auVar13._12_4_ * auVar12._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar15);
  auVar148._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar148._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar148._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar148._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vsubps_avx(auVar9,auVar63);
  auVar90._1_3_ = 0;
  auVar90[0] = PVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar163._0_4_ = auVar14._0_4_ * auVar10._0_4_;
  auVar163._4_4_ = auVar14._4_4_ * auVar10._4_4_;
  auVar163._8_4_ = auVar14._8_4_ * auVar10._8_4_;
  auVar163._12_4_ = auVar14._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar63);
  auVar89._0_4_ = auVar14._0_4_ * auVar9._0_4_;
  auVar89._4_4_ = auVar14._4_4_ * auVar9._4_4_;
  auVar89._8_4_ = auVar14._8_4_ * auVar9._8_4_;
  auVar89._12_4_ = auVar14._12_4_ * auVar9._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar49 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar109);
  auVar122._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar122._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar122._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar122._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar15);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar109);
  auVar63._0_4_ = auVar64._0_4_ * auVar9._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar9._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar9._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar136,auVar148);
  auVar10 = vpminsd_avx(auVar163,auVar89);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar122,auVar63);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar213._4_4_ = uVar59;
  auVar213._0_4_ = uVar59;
  auVar213._8_4_ = uVar59;
  auVar213._12_4_ = uVar59;
  auVar10 = vmaxps_avx(auVar10,auVar213);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar200._0_4_ = auVar9._0_4_ * 0.99999964;
  auVar200._4_4_ = auVar9._4_4_ * 0.99999964;
  auVar200._8_4_ = auVar9._8_4_ * 0.99999964;
  auVar200._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar136,auVar148);
  auVar10 = vpmaxsd_avx(auVar163,auVar89);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar122,auVar63);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar109._4_4_ = uVar59;
  auVar109._0_4_ = uVar59;
  auVar109._8_4_ = uVar59;
  auVar109._12_4_ = uVar59;
  auVar10 = vminps_avx(auVar10,auVar109);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar64._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar90[4] = PVar3;
  auVar90._5_3_ = 0;
  auVar90[8] = PVar3;
  auVar90._9_3_ = 0;
  auVar90[0xc] = PVar3;
  auVar90._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar90,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(auVar200,auVar64,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar53 = vmovmskps_avx(auVar9);
  local_518 = pre->ray_space + k;
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  local_520 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01109f29:
  pLVar47 = local_518;
  local_510 = (ulong)uVar53;
  if (local_510 == 0) {
LAB_0110bb4a:
    return local_510 != 0;
  }
  lVar50 = 0;
  for (uVar49 = local_510; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar53 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar53].ptr;
  uVar49 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar9 = *(undefined1 (*) [16])(_Var8 + uVar49 * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 1) * (long)pvVar7);
  auVar12 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 2) * (long)pvVar7);
  auVar13 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar49 + 3));
  lVar50 = *(long *)&pGVar5[1].time_range.upper;
  auVar14 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar49);
  auVar15 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 1));
  auVar64 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 2));
  uVar56 = local_510 - 1 & local_510;
  auVar63 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 3));
  if (uVar56 != 0) {
    uVar54 = uVar56 - 1 & uVar56;
    for (uVar49 = uVar56; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar109 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar109 = vinsertps_avx(auVar109,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar122 = ZEXT816(0) << 0x40;
  auVar91._0_4_ = auVar63._0_4_ * 0.0;
  auVar91._4_4_ = auVar63._4_4_ * 0.0;
  auVar91._8_4_ = auVar63._8_4_ * 0.0;
  auVar91._12_4_ = auVar63._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar91,auVar64,auVar122);
  auVar89 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar15,auVar62);
  local_658._0_4_ = auVar14._0_4_ + auVar89._0_4_;
  local_658._4_4_ = auVar14._4_4_ + auVar89._4_4_;
  uStack_650._0_4_ = auVar14._8_4_ + auVar89._8_4_;
  uStack_650._4_4_ = auVar14._12_4_ + auVar89._12_4_;
  auVar271._8_4_ = 0x40400000;
  auVar271._0_8_ = 0x4040000040400000;
  auVar271._12_4_ = 0x40400000;
  auVar89 = vfmadd231ps_fma(auVar62,auVar15,auVar271);
  auVar90 = vfnmadd231ps_fma(auVar89,auVar14,auVar271);
  auVar247._0_4_ = auVar13._0_4_ * 0.0;
  auVar247._4_4_ = auVar13._4_4_ * 0.0;
  auVar247._8_4_ = auVar13._8_4_ * 0.0;
  auVar247._12_4_ = auVar13._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar247,auVar12,auVar122);
  auVar89 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar62);
  auVar259._0_4_ = auVar9._0_4_ + auVar89._0_4_;
  auVar259._4_4_ = auVar9._4_4_ + auVar89._4_4_;
  auVar259._8_4_ = auVar9._8_4_ + auVar89._8_4_;
  auVar259._12_4_ = auVar9._12_4_ + auVar89._12_4_;
  auVar89 = vfmadd231ps_fma(auVar62,auVar10,auVar271);
  auVar62 = vfnmadd231ps_fma(auVar89,auVar9,auVar271);
  auVar89 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar64,auVar63);
  auVar89 = vfmadd231ps_fma(auVar89,auVar15,auVar122);
  auVar89 = vfmadd231ps_fma(auVar89,auVar14,auVar122);
  auVar137._0_4_ = auVar63._0_4_ * 3.0;
  auVar137._4_4_ = auVar63._4_4_ * 3.0;
  auVar137._8_4_ = auVar63._8_4_ * 3.0;
  auVar137._12_4_ = auVar63._12_4_ * 3.0;
  auVar64 = vfnmadd231ps_fma(auVar137,auVar271,auVar64);
  auVar15 = vfmadd231ps_fma(auVar64,auVar122,auVar15);
  auVar64 = vfnmadd231ps_fma(auVar15,auVar122,auVar14);
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar12,auVar13);
  auVar14 = vfmadd231ps_fma(auVar14,auVar10,auVar122);
  auVar14 = vfmadd231ps_fma(auVar14,auVar9,auVar122);
  auVar230._0_4_ = auVar13._0_4_ * 3.0;
  auVar230._4_4_ = auVar13._4_4_ * 3.0;
  auVar230._8_4_ = auVar13._8_4_ * 3.0;
  auVar230._12_4_ = auVar13._12_4_ * 3.0;
  auVar12 = vfnmadd231ps_fma(auVar230,auVar271,auVar12);
  auVar10 = vfmadd231ps_fma(auVar12,auVar122,auVar10);
  auVar15 = vfnmadd231ps_fma(auVar10,auVar122,auVar9);
  auVar9 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar10 = vshufps_avx(auVar259,auVar259,0xc9);
  fVar121 = auVar90._0_4_;
  auVar164._0_4_ = fVar121 * auVar10._0_4_;
  fVar83 = auVar90._4_4_;
  auVar164._4_4_ = fVar83 * auVar10._4_4_;
  fVar85 = auVar90._8_4_;
  auVar164._8_4_ = fVar85 * auVar10._8_4_;
  fVar145 = auVar90._12_4_;
  auVar164._12_4_ = fVar145 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar164,auVar9,auVar259);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar165._0_4_ = fVar121 * auVar10._0_4_;
  auVar165._4_4_ = fVar83 * auVar10._4_4_;
  auVar165._8_4_ = fVar85 * auVar10._8_4_;
  auVar165._12_4_ = fVar145 * auVar10._12_4_;
  auVar9 = vfmsub231ps_fma(auVar165,auVar9,auVar62);
  auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar10 = vshufps_avx(auVar64,auVar64,0xc9);
  auVar9 = vshufps_avx(auVar14,auVar14,0xc9);
  fVar60 = auVar64._0_4_;
  auVar149._0_4_ = fVar60 * auVar9._0_4_;
  fVar228 = auVar64._4_4_;
  auVar149._4_4_ = fVar228 * auVar9._4_4_;
  fVar133 = auVar64._8_4_;
  auVar149._8_4_ = fVar133 * auVar9._8_4_;
  fVar134 = auVar64._12_4_;
  auVar149._12_4_ = fVar134 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar149,auVar10,auVar14);
  auVar14 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar185._0_4_ = fVar60 * auVar9._0_4_;
  auVar185._4_4_ = fVar228 * auVar9._4_4_;
  auVar185._8_4_ = fVar133 * auVar9._8_4_;
  auVar185._12_4_ = fVar134 * auVar9._12_4_;
  auVar9 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar10 = vfmsub231ps_fma(auVar185,auVar10,auVar15);
  auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar82 = auVar9._0_4_;
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = fVar82;
  auVar10 = vrsqrtss_avx(auVar231,auVar231);
  fVar58 = auVar10._0_4_;
  fVar84 = fVar58 * 1.5 - fVar82 * 0.5 * fVar58 * fVar58 * fVar58;
  fVar162 = auVar12._0_4_ * fVar84;
  fVar180 = auVar12._4_4_ * fVar84;
  fVar181 = auVar12._8_4_ * fVar84;
  fVar182 = auVar12._12_4_ * fVar84;
  auVar10 = vdpps_avx(auVar12,auVar13,0x7f);
  auVar241._0_4_ = auVar13._0_4_ * fVar82;
  auVar241._4_4_ = auVar13._4_4_ * fVar82;
  auVar241._8_4_ = auVar13._8_4_ * fVar82;
  auVar241._12_4_ = auVar13._12_4_ * fVar82;
  fVar58 = auVar10._0_4_;
  auVar201._0_4_ = auVar12._0_4_ * fVar58;
  auVar201._4_4_ = auVar12._4_4_ * fVar58;
  auVar201._8_4_ = auVar12._8_4_ * fVar58;
  auVar201._12_4_ = auVar12._12_4_ * fVar58;
  auVar12 = vsubps_avx(auVar241,auVar201);
  auVar10 = vrcpss_avx(auVar231,auVar231);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar58 = auVar10._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar82 = auVar9._0_4_;
  auVar214._4_12_ = ZEXT812(0) << 0x20;
  auVar214._0_4_ = fVar82;
  auVar10 = vrsqrtss_avx(auVar214,auVar214);
  fVar86 = auVar10._0_4_;
  fVar86 = fVar86 * 1.5 - fVar82 * 0.5 * fVar86 * fVar86 * fVar86;
  auVar10 = vdpps_avx(auVar14,auVar15,0x7f);
  fVar258 = fVar86 * auVar14._0_4_;
  fVar268 = fVar86 * auVar14._4_4_;
  fVar269 = fVar86 * auVar14._8_4_;
  fVar270 = fVar86 * auVar14._12_4_;
  auVar186._0_4_ = fVar82 * auVar15._0_4_;
  auVar186._4_4_ = fVar82 * auVar15._4_4_;
  auVar186._8_4_ = fVar82 * auVar15._8_4_;
  auVar186._12_4_ = fVar82 * auVar15._12_4_;
  fVar82 = auVar10._0_4_;
  auVar150._0_4_ = fVar82 * auVar14._0_4_;
  auVar150._4_4_ = fVar82 * auVar14._4_4_;
  auVar150._8_4_ = fVar82 * auVar14._8_4_;
  auVar150._12_4_ = fVar82 * auVar14._12_4_;
  auVar13 = vsubps_avx(auVar186,auVar150);
  auVar10 = vrcpss_avx(auVar214,auVar214);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,ZEXT416(0x40000000));
  fVar82 = auVar9._0_4_ * auVar10._0_4_;
  auVar9 = vshufps_avx(_local_658,_local_658,0xff);
  auVar215._0_4_ = auVar9._0_4_ * fVar162;
  auVar215._4_4_ = auVar9._4_4_ * fVar180;
  auVar215._8_4_ = auVar9._8_4_ * fVar181;
  auVar215._12_4_ = auVar9._12_4_ * fVar182;
  local_468 = vsubps_avx(_local_658,auVar215);
  auVar10 = vshufps_avx(auVar90,auVar90,0xff);
  auVar166._0_4_ = auVar10._0_4_ * fVar162 + fVar84 * auVar12._0_4_ * fVar58 * auVar9._0_4_;
  auVar166._4_4_ = auVar10._4_4_ * fVar180 + fVar84 * auVar12._4_4_ * fVar58 * auVar9._4_4_;
  auVar166._8_4_ = auVar10._8_4_ * fVar181 + fVar84 * auVar12._8_4_ * fVar58 * auVar9._8_4_;
  auVar166._12_4_ = auVar10._12_4_ * fVar182 + fVar84 * auVar12._12_4_ * fVar58 * auVar9._12_4_;
  auVar12 = vsubps_avx(auVar90,auVar166);
  local_478._0_4_ = auVar215._0_4_ + (float)local_658._0_4_;
  local_478._4_4_ = auVar215._4_4_ + (float)local_658._4_4_;
  fStack_470 = auVar215._8_4_ + (float)uStack_650;
  fStack_46c = auVar215._12_4_ + uStack_650._4_4_;
  auVar9 = vshufps_avx(auVar89,auVar89,0xff);
  auVar110._0_4_ = fVar258 * auVar9._0_4_;
  auVar110._4_4_ = fVar268 * auVar9._4_4_;
  auVar110._8_4_ = fVar269 * auVar9._8_4_;
  auVar110._12_4_ = fVar270 * auVar9._12_4_;
  local_488 = vsubps_avx(auVar89,auVar110);
  auVar10 = vshufps_avx(auVar64,auVar64,0xff);
  auVar124._0_4_ = fVar258 * auVar10._0_4_ + auVar9._0_4_ * fVar86 * auVar13._0_4_ * fVar82;
  auVar124._4_4_ = fVar268 * auVar10._4_4_ + auVar9._4_4_ * fVar86 * auVar13._4_4_ * fVar82;
  auVar124._8_4_ = fVar269 * auVar10._8_4_ + auVar9._8_4_ * fVar86 * auVar13._8_4_ * fVar82;
  auVar124._12_4_ = fVar270 * auVar10._12_4_ + auVar9._12_4_ * fVar86 * auVar13._12_4_ * fVar82;
  auVar9 = vsubps_avx(auVar64,auVar124);
  fVar162 = auVar89._0_4_ + auVar110._0_4_;
  fVar180 = auVar89._4_4_ + auVar110._4_4_;
  fVar181 = auVar89._8_4_ + auVar110._8_4_;
  fVar182 = auVar89._12_4_ + auVar110._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar12._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar12._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar12._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar12._12_4_ * 0.33333334;
  auVar92._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar92._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar92._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar92._12_4_ = auVar9._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar92);
  local_448 = vsubps_avx(local_468,auVar109);
  auVar9 = vshufps_avx(local_448,local_448,0x55);
  auVar10 = vshufps_avx(local_448,local_448,0xaa);
  aVar2 = (local_518->vy).field_0;
  fVar58 = (local_518->vz).field_0.m128[0];
  fVar82 = *(float *)((long)&(local_518->vz).field_0 + 4);
  fVar84 = *(float *)((long)&(local_518->vz).field_0 + 8);
  fVar86 = *(float *)((long)&(local_518->vz).field_0 + 0xc);
  auVar93._0_4_ = fVar58 * auVar10._0_4_;
  auVar93._4_4_ = fVar82 * auVar10._4_4_;
  auVar93._8_4_ = fVar84 * auVar10._8_4_;
  auVar93._12_4_ = fVar86 * auVar10._12_4_;
  auVar12 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar2,auVar9);
  local_458 = vsubps_avx(local_498,auVar109);
  auVar9 = vshufps_avx(local_458,local_458,0x55);
  auVar10 = vshufps_avx(local_458,local_458,0xaa);
  auVar277._0_4_ = fVar58 * auVar10._0_4_;
  auVar277._4_4_ = fVar82 * auVar10._4_4_;
  auVar277._8_4_ = fVar84 * auVar10._8_4_;
  auVar277._12_4_ = fVar86 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar2,auVar9);
  auVar63 = vsubps_avx(local_4a8,auVar109);
  auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar248._0_4_ = fVar58 * auVar9._0_4_;
  auVar248._4_4_ = fVar82 * auVar9._4_4_;
  auVar248._8_4_ = fVar84 * auVar9._8_4_;
  auVar248._12_4_ = fVar86 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar63,auVar63,0x55);
  auVar13 = vfmadd231ps_fma(auVar248,(undefined1  [16])aVar2,auVar9);
  auVar89 = vsubps_avx(local_488,auVar109);
  auVar9 = vshufps_avx(auVar89,auVar89,0xaa);
  auVar260._0_4_ = fVar58 * auVar9._0_4_;
  auVar260._4_4_ = fVar82 * auVar9._4_4_;
  auVar260._8_4_ = fVar84 * auVar9._8_4_;
  auVar260._12_4_ = fVar86 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar89,auVar89,0x55);
  auVar14 = vfmadd231ps_fma(auVar260,(undefined1  [16])aVar2,auVar9);
  auVar62 = vsubps_avx(_local_478,auVar109);
  auVar9 = vshufps_avx(auVar62,auVar62,0xaa);
  auVar151._0_4_ = fVar58 * auVar9._0_4_;
  auVar151._4_4_ = fVar82 * auVar9._4_4_;
  auVar151._8_4_ = fVar84 * auVar9._8_4_;
  auVar151._12_4_ = fVar86 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar62,auVar62,0x55);
  auVar15 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar9);
  local_4b8._0_4_ = (fVar121 + auVar166._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar83 + auVar166._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar85 + auVar166._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar145 + auVar166._12_4_) * 0.33333334 + fStack_46c;
  auVar90 = vsubps_avx(_local_4b8,auVar109);
  auVar9 = vshufps_avx(auVar90,auVar90,0xaa);
  auVar202._0_4_ = auVar9._0_4_ * fVar58;
  auVar202._4_4_ = auVar9._4_4_ * fVar82;
  auVar202._8_4_ = auVar9._8_4_ * fVar84;
  auVar202._12_4_ = auVar9._12_4_ * fVar86;
  auVar9 = vshufps_avx(auVar90,auVar90,0x55);
  auVar64 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar9);
  auVar216._0_4_ = (fVar60 + auVar124._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar228 + auVar124._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar133 + auVar124._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar134 + auVar124._12_4_) * 0.33333334;
  auVar127._4_4_ = fVar180;
  auVar127._0_4_ = fVar162;
  auVar127._8_4_ = fVar181;
  auVar127._12_4_ = fVar182;
  _local_4c8 = vsubps_avx(auVar127,auVar216);
  auVar122 = vsubps_avx(_local_4c8,auVar109);
  auVar9 = vshufps_avx(auVar122,auVar122,0xaa);
  auVar217._0_4_ = auVar9._0_4_ * fVar58;
  auVar217._4_4_ = auVar9._4_4_ * fVar82;
  auVar217._8_4_ = auVar9._8_4_ * fVar84;
  auVar217._12_4_ = auVar9._12_4_ * fVar86;
  auVar9 = vshufps_avx(auVar122,auVar122,0x55);
  auVar136 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar9);
  auVar109 = vsubps_avx(auVar127,auVar109);
  auVar9 = vshufps_avx(auVar109,auVar109,0xaa);
  auVar65._0_4_ = fVar58 * auVar9._0_4_;
  auVar65._4_4_ = fVar82 * auVar9._4_4_;
  auVar65._8_4_ = fVar84 * auVar9._8_4_;
  auVar65._12_4_ = fVar86 * auVar9._12_4_;
  auVar9 = vshufps_avx(auVar109,auVar109,0x55);
  auVar9 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar9);
  auVar167._4_4_ = local_448._0_4_;
  auVar167._0_4_ = local_448._0_4_;
  auVar167._8_4_ = local_448._0_4_;
  auVar167._12_4_ = local_448._0_4_;
  aVar2 = (local_518->vx).field_0;
  auVar61 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar167);
  auVar168._4_4_ = local_458._0_4_;
  auVar168._0_4_ = local_458._0_4_;
  auVar168._8_4_ = local_458._0_4_;
  auVar168._12_4_ = local_458._0_4_;
  auVar88 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar168);
  uVar59 = auVar63._0_4_;
  auVar169._4_4_ = uVar59;
  auVar169._0_4_ = uVar59;
  auVar169._8_4_ = uVar59;
  auVar169._12_4_ = uVar59;
  auVar135 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar169);
  uVar59 = auVar89._0_4_;
  auVar170._4_4_ = uVar59;
  auVar170._0_4_ = uVar59;
  auVar170._8_4_ = uVar59;
  auVar170._12_4_ = uVar59;
  auVar146 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar170);
  uVar59 = auVar62._0_4_;
  auVar171._4_4_ = uVar59;
  auVar171._0_4_ = uVar59;
  auVar171._8_4_ = uVar59;
  auVar171._12_4_ = uVar59;
  auVar147 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar2,auVar171);
  uVar59 = auVar90._0_4_;
  auVar172._4_4_ = uVar59;
  auVar172._0_4_ = uVar59;
  auVar172._8_4_ = uVar59;
  auVar172._12_4_ = uVar59;
  auVar148 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar172);
  uVar59 = auVar122._0_4_;
  auVar173._4_4_ = uVar59;
  auVar173._0_4_ = uVar59;
  auVar173._8_4_ = uVar59;
  auVar173._12_4_ = uVar59;
  auVar163 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar2,auVar173);
  uVar59 = auVar109._0_4_;
  auVar174._4_4_ = uVar59;
  auVar174._0_4_ = uVar59;
  auVar174._8_4_ = uVar59;
  auVar174._12_4_ = uVar59;
  auVar183 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar174);
  auVar13 = vmovlhps_avx(auVar61,auVar147);
  auVar14 = vmovlhps_avx(auVar88,auVar148);
  auVar15 = vmovlhps_avx(auVar135,auVar163);
  auVar64 = vmovlhps_avx(auVar146,auVar183);
  auVar9 = vminps_avx(auVar13,auVar14);
  auVar10 = vminps_avx(auVar15,auVar64);
  auVar12 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar13,auVar14);
  auVar10 = vmaxps_avx(auVar15,auVar64);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vshufpd_avx(auVar12,auVar12,3);
  auVar12 = vminps_avx(auVar12,auVar10);
  auVar10 = vshufpd_avx(auVar9,auVar9,3);
  auVar10 = vmaxps_avx(auVar9,auVar10);
  auVar9 = vandps_avx(local_428,auVar12);
  auVar10 = vandps_avx(local_428,auVar10);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  fVar82 = auVar9._0_4_ * 9.536743e-07;
  auVar187._8_8_ = auVar61._0_8_;
  auVar187._0_8_ = auVar61._0_8_;
  auVar232._8_8_ = auVar88._0_8_;
  auVar232._0_8_ = auVar88._0_8_;
  auVar249._0_8_ = auVar135._0_8_;
  auVar249._8_8_ = auVar249._0_8_;
  auVar261._0_8_ = auVar146._0_8_;
  auVar261._8_8_ = auVar261._0_8_;
  local_438 = 0x80000000;
  uStack_434 = 0x80000000;
  uStack_430 = 0x80000000;
  uStack_42c = 0x80000000;
  local_78 = fVar82;
  fStack_74 = fVar82;
  fStack_70 = fVar82;
  fStack_6c = fVar82;
  fStack_68 = fVar82;
  fStack_64 = fVar82;
  fStack_60 = fVar82;
  fStack_5c = fVar82;
  fStack_90 = -fVar82;
  local_98 = -fVar82;
  fStack_94 = -fVar82;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar55 = false;
  uVar49 = 0;
  fVar58 = *(float *)(ray + k * 4 + 0x30);
  auVar10 = vsubps_avx(auVar14,auVar13);
  auVar12 = vsubps_avx(auVar15,auVar14);
  auVar136 = vsubps_avx(auVar64,auVar15);
  auVar61 = vsubps_avx(_local_478,local_468);
  auVar88 = vsubps_avx(_local_4b8,local_498);
  auVar135 = vsubps_avx(_local_4c8,local_4a8);
  auVar242._4_4_ = fVar180;
  auVar242._0_4_ = fVar162;
  auVar242._8_4_ = fVar181;
  auVar242._12_4_ = fVar182;
  auVar146 = vsubps_avx(auVar242,local_488);
  auVar66 = ZEXT816(0x3f80000000000000);
  auVar9 = auVar66;
LAB_0110a6e9:
  auVar184 = vshufps_avx(auVar66,auVar66,0x50);
  auVar278._8_4_ = 0x3f800000;
  auVar278._0_8_ = 0x3f8000003f800000;
  auVar278._12_4_ = 0x3f800000;
  auVar281._16_4_ = 0x3f800000;
  auVar281._0_16_ = auVar278;
  auVar281._20_4_ = 0x3f800000;
  auVar281._24_4_ = 0x3f800000;
  auVar281._28_4_ = 0x3f800000;
  auVar212 = vsubps_avx(auVar278,auVar184);
  fVar84 = auVar184._0_4_;
  fVar134 = auVar147._0_4_;
  auVar67._0_4_ = fVar134 * fVar84;
  fVar86 = auVar184._4_4_;
  fVar258 = auVar147._4_4_;
  auVar67._4_4_ = fVar258 * fVar86;
  fVar121 = auVar184._8_4_;
  auVar67._8_4_ = fVar134 * fVar121;
  fVar83 = auVar184._12_4_;
  auVar67._12_4_ = fVar258 * fVar83;
  fVar268 = auVar148._0_4_;
  auVar175._0_4_ = fVar268 * fVar84;
  fVar269 = auVar148._4_4_;
  auVar175._4_4_ = fVar269 * fVar86;
  auVar175._8_4_ = fVar268 * fVar121;
  auVar175._12_4_ = fVar269 * fVar83;
  fVar199 = auVar163._0_4_;
  auVar138._0_4_ = fVar199 * fVar84;
  fVar210 = auVar163._4_4_;
  auVar138._4_4_ = fVar210 * fVar86;
  auVar138._8_4_ = fVar199 * fVar121;
  auVar138._12_4_ = fVar210 * fVar83;
  fVar211 = auVar183._0_4_;
  auVar111._0_4_ = fVar211 * fVar84;
  fVar227 = auVar183._4_4_;
  auVar111._4_4_ = fVar227 * fVar86;
  auVar111._8_4_ = fVar211 * fVar121;
  auVar111._12_4_ = fVar227 * fVar83;
  auVar250 = vfmadd231ps_fma(auVar67,auVar212,auVar187);
  auVar154 = vfmadd231ps_fma(auVar175,auVar212,auVar232);
  auVar127 = vfmadd231ps_fma(auVar138,auVar212,auVar249);
  auVar242 = vfmadd231ps_fma(auVar111,auVar261,auVar212);
  auVar184 = vmovshdup_avx(auVar9);
  fVar84 = auVar9._0_4_;
  fStack_140 = (auVar184._0_4_ - fVar84) * 0.04761905;
  auVar225._4_4_ = fVar84;
  auVar225._0_4_ = fVar84;
  auVar225._8_4_ = fVar84;
  auVar225._12_4_ = fVar84;
  auVar225._16_4_ = fVar84;
  auVar225._20_4_ = fVar84;
  auVar225._24_4_ = fVar84;
  auVar225._28_4_ = fVar84;
  auVar105._0_8_ = auVar184._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar79 = vsubps_avx(auVar105,auVar225);
  uVar59 = auVar250._0_4_;
  auVar275._4_4_ = uVar59;
  auVar275._0_4_ = uVar59;
  auVar275._8_4_ = uVar59;
  auVar275._12_4_ = uVar59;
  auVar275._16_4_ = uVar59;
  auVar275._20_4_ = uVar59;
  auVar275._24_4_ = uVar59;
  auVar275._28_4_ = uVar59;
  auVar184 = vmovshdup_avx(auVar250);
  uVar87 = auVar184._0_8_;
  auVar267._8_8_ = uVar87;
  auVar267._0_8_ = uVar87;
  auVar267._16_8_ = uVar87;
  auVar267._24_8_ = uVar87;
  fVar133 = auVar154._0_4_;
  auVar255._4_4_ = fVar133;
  auVar255._0_4_ = fVar133;
  auVar255._8_4_ = fVar133;
  auVar255._12_4_ = fVar133;
  auVar255._16_4_ = fVar133;
  auVar255._20_4_ = fVar133;
  auVar255._24_4_ = fVar133;
  auVar255._28_4_ = fVar133;
  auVar212 = vmovshdup_avx(auVar154);
  auVar106._0_8_ = auVar212._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar228 = auVar127._0_4_;
  auVar190._4_4_ = fVar228;
  auVar190._0_4_ = fVar228;
  auVar190._8_4_ = fVar228;
  auVar190._12_4_ = fVar228;
  auVar190._16_4_ = fVar228;
  auVar190._20_4_ = fVar228;
  auVar190._24_4_ = fVar228;
  auVar190._28_4_ = fVar228;
  auVar213 = vmovshdup_avx(auVar127);
  auVar208._0_8_ = auVar213._0_8_;
  auVar208._8_8_ = auVar208._0_8_;
  auVar208._16_8_ = auVar208._0_8_;
  auVar208._24_8_ = auVar208._0_8_;
  fVar60 = auVar242._0_4_;
  auVar229 = vmovshdup_avx(auVar242);
  auVar65 = vfmadd132ps_fma(auVar79,auVar225,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar281,ZEXT1632(auVar65));
  fVar84 = auVar65._0_4_;
  fVar86 = auVar65._4_4_;
  auVar16._4_4_ = fVar133 * fVar86;
  auVar16._0_4_ = fVar133 * fVar84;
  fVar121 = auVar65._8_4_;
  auVar16._8_4_ = fVar133 * fVar121;
  fVar83 = auVar65._12_4_;
  auVar16._12_4_ = fVar133 * fVar83;
  auVar16._16_4_ = fVar133 * 0.0;
  auVar16._20_4_ = fVar133 * 0.0;
  auVar16._24_4_ = fVar133 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar65 = vfmadd231ps_fma(auVar16,auVar79,auVar275);
  fVar85 = auVar212._0_4_;
  fVar145 = auVar212._4_4_;
  auVar17._4_4_ = fVar145 * fVar86;
  auVar17._0_4_ = fVar85 * fVar84;
  auVar17._8_4_ = fVar85 * fVar121;
  auVar17._12_4_ = fVar145 * fVar83;
  auVar17._16_4_ = fVar85 * 0.0;
  auVar17._20_4_ = fVar145 * 0.0;
  auVar17._24_4_ = fVar85 * 0.0;
  auVar17._28_4_ = uVar59;
  auVar91 = vfmadd231ps_fma(auVar17,auVar79,auVar267);
  auVar18._4_4_ = fVar228 * fVar86;
  auVar18._0_4_ = fVar228 * fVar84;
  auVar18._8_4_ = fVar228 * fVar121;
  auVar18._12_4_ = fVar228 * fVar83;
  auVar18._16_4_ = fVar228 * 0.0;
  auVar18._20_4_ = fVar228 * 0.0;
  auVar18._24_4_ = fVar228 * 0.0;
  auVar18._28_4_ = auVar184._4_4_;
  auVar124 = vfmadd231ps_fma(auVar18,auVar79,auVar255);
  fVar85 = auVar213._0_4_;
  fVar145 = auVar213._4_4_;
  auVar11._4_4_ = fVar145 * fVar86;
  auVar11._0_4_ = fVar85 * fVar84;
  auVar11._8_4_ = fVar85 * fVar121;
  auVar11._12_4_ = fVar145 * fVar83;
  auVar11._16_4_ = fVar85 * 0.0;
  auVar11._20_4_ = fVar145 * 0.0;
  auVar11._24_4_ = fVar85 * 0.0;
  auVar11._28_4_ = fVar133;
  auVar92 = vfmadd231ps_fma(auVar11,auVar79,auVar106);
  auVar184 = vshufps_avx(auVar250,auVar250,0xaa);
  local_578._8_8_ = auVar184._0_8_;
  local_578._0_8_ = local_578._8_8_;
  local_578._16_8_ = local_578._8_8_;
  local_578._24_8_ = local_578._8_8_;
  auVar212 = vshufps_avx(auVar250,auVar250,0xff);
  uStack_650 = auVar212._0_8_;
  local_658 = (undefined1  [8])uStack_650;
  uStack_648 = uStack_650;
  uStack_640 = uStack_650;
  auVar19._4_4_ = fVar60 * fVar86;
  auVar19._0_4_ = fVar60 * fVar84;
  auVar19._8_4_ = fVar60 * fVar121;
  auVar19._12_4_ = fVar60 * fVar83;
  auVar19._16_4_ = fVar60 * 0.0;
  auVar19._20_4_ = fVar60 * 0.0;
  auVar19._24_4_ = fVar60 * 0.0;
  auVar19._28_4_ = fVar60;
  auVar250 = vfmadd231ps_fma(auVar19,auVar79,auVar190);
  auVar212 = vshufps_avx(auVar154,auVar154,0xaa);
  auVar191._0_8_ = auVar212._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar191._16_8_ = auVar191._0_8_;
  auVar191._24_8_ = auVar191._0_8_;
  auVar213 = vshufps_avx(auVar154,auVar154,0xff);
  local_4e8._8_8_ = auVar213._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar85 = auVar229._0_4_;
  fVar145 = auVar229._4_4_;
  auVar20._4_4_ = fVar145 * fVar86;
  auVar20._0_4_ = fVar85 * fVar84;
  auVar20._8_4_ = fVar85 * fVar121;
  auVar20._12_4_ = fVar145 * fVar83;
  auVar20._16_4_ = fVar85 * 0.0;
  auVar20._20_4_ = fVar145 * 0.0;
  auVar20._24_4_ = fVar85 * 0.0;
  auVar20._28_4_ = auVar184._4_4_;
  auVar93 = vfmadd231ps_fma(auVar20,auVar79,auVar208);
  auVar257._28_4_ = fVar145;
  auVar257._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar83,
                          CONCAT48(auVar124._8_4_ * fVar121,
                                   CONCAT44(auVar124._4_4_ * fVar86,auVar124._0_4_ * fVar84))));
  auVar65 = vfmadd231ps_fma(auVar257,auVar79,ZEXT1632(auVar65));
  fVar85 = auVar213._4_4_;
  auVar22._28_4_ = fVar85;
  auVar22._0_28_ =
       ZEXT1628(CONCAT412(auVar92._12_4_ * fVar83,
                          CONCAT48(auVar92._8_4_ * fVar121,
                                   CONCAT44(auVar92._4_4_ * fVar86,auVar92._0_4_ * fVar84))));
  auVar91 = vfmadd231ps_fma(auVar22,auVar79,ZEXT1632(auVar91));
  auVar184 = vshufps_avx(auVar127,auVar127,0xaa);
  uVar87 = auVar184._0_8_;
  auVar179._8_8_ = uVar87;
  auVar179._0_8_ = uVar87;
  auVar179._16_8_ = uVar87;
  auVar179._24_8_ = uVar87;
  auVar229 = vshufps_avx(auVar127,auVar127,0xff);
  uVar87 = auVar229._0_8_;
  auVar282._8_8_ = uVar87;
  auVar282._0_8_ = uVar87;
  auVar282._16_8_ = uVar87;
  auVar282._24_8_ = uVar87;
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar250._12_4_ * fVar83,
                                                CONCAT48(auVar250._8_4_ * fVar121,
                                                         CONCAT44(auVar250._4_4_ * fVar86,
                                                                  auVar250._0_4_ * fVar84)))),
                             auVar79,ZEXT1632(auVar124));
  auVar250 = vshufps_avx(auVar242,auVar242,0xaa);
  auVar154 = vshufps_avx(auVar242,auVar242,0xff);
  auVar242 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar93._12_4_,
                                                CONCAT48(fVar121 * auVar93._8_4_,
                                                         CONCAT44(fVar86 * auVar93._4_4_,
                                                                  fVar84 * auVar93._0_4_)))),auVar79
                             ,ZEXT1632(auVar92));
  auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar127._12_4_,
                                                CONCAT48(fVar121 * auVar127._8_4_,
                                                         CONCAT44(fVar86 * auVar127._4_4_,
                                                                  fVar84 * auVar127._0_4_)))),
                             auVar79,ZEXT1632(auVar65));
  auVar16 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar65));
  auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar242._12_4_,
                                                CONCAT48(fVar121 * auVar242._8_4_,
                                                         CONCAT44(fVar86 * auVar242._4_4_,
                                                                  fVar84 * auVar242._0_4_)))),
                             auVar79,ZEXT1632(auVar91));
  auVar17 = vsubps_avx(ZEXT1632(auVar242),ZEXT1632(auVar91));
  fVar145 = auVar17._28_4_;
  auVar256._0_4_ = fStack_140 * auVar16._0_4_ * 3.0;
  auVar256._4_4_ = fStack_140 * auVar16._4_4_ * 3.0;
  auVar256._8_4_ = fStack_140 * auVar16._8_4_ * 3.0;
  auVar256._12_4_ = fStack_140 * auVar16._12_4_ * 3.0;
  auVar256._16_4_ = fStack_140 * auVar16._16_4_ * 3.0;
  auVar256._20_4_ = fStack_140 * auVar16._20_4_ * 3.0;
  auVar256._24_4_ = fStack_140 * auVar16._24_4_ * 3.0;
  auVar256._28_4_ = 0;
  local_418._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  local_418._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  fStack_410 = fStack_140 * auVar17._8_4_ * 3.0;
  fStack_40c = fStack_140 * auVar17._12_4_ * 3.0;
  fStack_408 = fStack_140 * auVar17._16_4_ * 3.0;
  fStack_404 = fStack_140 * auVar17._20_4_ * 3.0;
  fStack_400 = fStack_140 * auVar17._24_4_ * 3.0;
  fStack_3fc = fVar145;
  fVar60 = auVar212._0_4_;
  fVar228 = auVar212._4_4_;
  auVar23._4_4_ = fVar228 * fVar86;
  auVar23._0_4_ = fVar60 * fVar84;
  auVar23._8_4_ = fVar60 * fVar121;
  auVar23._12_4_ = fVar228 * fVar83;
  auVar23._16_4_ = fVar60 * 0.0;
  auVar23._20_4_ = fVar228 * 0.0;
  auVar23._24_4_ = fVar60 * 0.0;
  auVar23._28_4_ = fVar145;
  auVar212 = vfmadd231ps_fma(auVar23,auVar79,local_578);
  fVar60 = auVar213._0_4_;
  auVar24._4_4_ = fVar85 * fVar86;
  auVar24._0_4_ = fVar60 * fVar84;
  auVar24._8_4_ = fVar60 * fVar121;
  auVar24._12_4_ = fVar85 * fVar83;
  auVar24._16_4_ = fVar60 * 0.0;
  auVar24._20_4_ = fVar85 * 0.0;
  auVar24._24_4_ = fVar60 * 0.0;
  auVar24._28_4_ = 0;
  auVar213 = vfmadd231ps_fma(auVar24,auVar79,_local_658);
  fVar85 = auVar184._0_4_;
  fVar60 = auVar184._4_4_;
  auVar25._4_4_ = fVar60 * fVar86;
  auVar25._0_4_ = fVar85 * fVar84;
  auVar25._8_4_ = fVar85 * fVar121;
  auVar25._12_4_ = fVar60 * fVar83;
  auVar25._16_4_ = fVar85 * 0.0;
  auVar25._20_4_ = fVar60 * 0.0;
  auVar25._24_4_ = fVar85 * 0.0;
  auVar25._28_4_ = auVar16._28_4_;
  auVar184 = vfmadd231ps_fma(auVar25,auVar79,auVar191);
  fVar85 = auVar229._0_4_;
  fVar133 = auVar229._4_4_;
  auVar26._4_4_ = fVar133 * fVar86;
  auVar26._0_4_ = fVar85 * fVar84;
  auVar26._8_4_ = fVar85 * fVar121;
  auVar26._12_4_ = fVar133 * fVar83;
  auVar26._16_4_ = fVar85 * 0.0;
  auVar26._20_4_ = fVar133 * 0.0;
  auVar26._24_4_ = fVar85 * 0.0;
  auVar26._28_4_ = fVar228;
  auVar229 = vfmadd231ps_fma(auVar26,auVar79,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar124));
  fVar85 = auVar250._0_4_;
  fVar60 = auVar250._4_4_;
  auVar27._4_4_ = fVar60 * fVar86;
  auVar27._0_4_ = fVar85 * fVar84;
  auVar27._8_4_ = fVar85 * fVar121;
  auVar27._12_4_ = fVar60 * fVar83;
  auVar27._16_4_ = fVar85 * 0.0;
  auVar27._20_4_ = fVar60 * 0.0;
  auVar27._24_4_ = fVar85 * 0.0;
  auVar27._28_4_ = fVar60;
  auVar250 = vfmadd231ps_fma(auVar27,auVar79,auVar179);
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar127));
  fVar85 = auVar154._0_4_;
  fVar60 = auVar154._4_4_;
  auVar28._4_4_ = fVar60 * fVar86;
  auVar28._0_4_ = fVar85 * fVar84;
  auVar28._8_4_ = fVar85 * fVar121;
  auVar28._12_4_ = fVar60 * fVar83;
  auVar28._16_4_ = fVar85 * 0.0;
  auVar28._20_4_ = fVar60 * 0.0;
  auVar28._24_4_ = fVar85 * 0.0;
  auVar28._28_4_ = fVar60;
  auVar154 = vfmadd231ps_fma(auVar28,auVar79,auVar282);
  auVar29._28_4_ = fVar133;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar184._12_4_ * fVar83,
                          CONCAT48(auVar184._8_4_ * fVar121,
                                   CONCAT44(auVar184._4_4_ * fVar86,auVar184._0_4_ * fVar84))));
  auVar212 = vfmadd231ps_fma(auVar29,auVar79,ZEXT1632(auVar212));
  auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar229._12_4_,
                                                CONCAT48(fVar121 * auVar229._8_4_,
                                                         CONCAT44(fVar86 * auVar229._4_4_,
                                                                  fVar84 * auVar229._0_4_)))),
                             auVar79,ZEXT1632(auVar213));
  auVar107._0_4_ = auVar124._0_4_ + auVar256._0_4_;
  auVar107._4_4_ = auVar124._4_4_ + auVar256._4_4_;
  auVar107._8_4_ = auVar124._8_4_ + auVar256._8_4_;
  auVar107._12_4_ = auVar124._12_4_ + auVar256._12_4_;
  auVar107._16_4_ = auVar256._16_4_ + 0.0;
  auVar107._20_4_ = auVar256._20_4_ + 0.0;
  auVar107._24_4_ = auVar256._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar250._12_4_ * fVar83,
                                                CONCAT48(auVar250._8_4_ * fVar121,
                                                         CONCAT44(auVar250._4_4_ * fVar86,
                                                                  auVar250._0_4_ * fVar84)))),
                             auVar79,ZEXT1632(auVar184));
  auVar229 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar154._12_4_ * fVar83,
                                                CONCAT48(auVar154._8_4_ * fVar121,
                                                         CONCAT44(auVar154._4_4_ * fVar86,
                                                                  auVar154._0_4_ * fVar84)))),
                             auVar79,ZEXT1632(auVar229));
  auVar250 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar83 * auVar184._12_4_,
                                                CONCAT48(fVar121 * auVar184._8_4_,
                                                         CONCAT44(fVar86 * auVar184._4_4_,
                                                                  fVar84 * auVar184._0_4_)))),
                             auVar79,ZEXT1632(auVar212));
  auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar229._12_4_ * fVar83,
                                                CONCAT48(auVar229._8_4_ * fVar121,
                                                         CONCAT44(auVar229._4_4_ * fVar86,
                                                                  auVar229._0_4_ * fVar84)))),
                             ZEXT1632(auVar213),auVar79);
  auVar79 = vsubps_avx(ZEXT1632(auVar184),ZEXT1632(auVar212));
  auVar16 = vsubps_avx(ZEXT1632(auVar229),ZEXT1632(auVar213));
  auVar276._0_4_ = fStack_140 * auVar79._0_4_ * 3.0;
  auVar276._4_4_ = fStack_140 * auVar79._4_4_ * 3.0;
  auVar276._8_4_ = fStack_140 * auVar79._8_4_ * 3.0;
  auVar276._12_4_ = fStack_140 * auVar79._12_4_ * 3.0;
  auVar276._16_4_ = fStack_140 * auVar79._16_4_ * 3.0;
  auVar276._20_4_ = fStack_140 * auVar79._20_4_ * 3.0;
  auVar276._24_4_ = fStack_140 * auVar79._24_4_ * 3.0;
  auVar276._28_4_ = 0;
  local_158 = fStack_140 * auVar16._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar16._4_4_ * 3.0;
  auVar30._4_4_ = fStack_154;
  auVar30._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar16._8_4_ * 3.0;
  auVar30._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar16._12_4_ * 3.0;
  auVar30._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar16._16_4_ * 3.0;
  auVar30._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar16._20_4_ * 3.0;
  auVar30._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar16._24_4_ * 3.0;
  auVar30._24_4_ = fStack_140;
  auVar30._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar250));
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar154));
  auVar79 = vsubps_avx(ZEXT1632(auVar250),ZEXT1632(auVar124));
  auVar16 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar127));
  auVar17 = vsubps_avx(_local_508,local_4e8);
  fVar270 = auVar79._0_4_ + auVar17._0_4_;
  fVar193 = auVar79._4_4_ + auVar17._4_4_;
  fVar194 = auVar79._8_4_ + auVar17._8_4_;
  fVar195 = auVar79._12_4_ + auVar17._12_4_;
  fVar196 = auVar79._16_4_ + auVar17._16_4_;
  fVar197 = auVar79._20_4_ + auVar17._20_4_;
  fVar198 = auVar79._24_4_ + auVar17._24_4_;
  auVar18 = vsubps_avx(auVar20,auVar19);
  auVar80._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar80._4_4_ = auVar16._4_4_ + auVar18._4_4_;
  auVar80._8_4_ = auVar16._8_4_ + auVar18._8_4_;
  auVar80._12_4_ = auVar16._12_4_ + auVar18._12_4_;
  auVar80._16_4_ = auVar16._16_4_ + auVar18._16_4_;
  auVar80._20_4_ = auVar16._20_4_ + auVar18._20_4_;
  auVar80._24_4_ = auVar16._24_4_ + auVar18._24_4_;
  auVar80._28_4_ = auVar16._28_4_ + auVar18._28_4_;
  local_f8 = ZEXT1632(auVar127);
  fVar84 = auVar127._0_4_;
  local_178 = (float)local_418._0_4_ + fVar84;
  fVar86 = auVar127._4_4_;
  fStack_174 = (float)local_418._4_4_ + fVar86;
  fVar121 = auVar127._8_4_;
  fStack_170 = fStack_410 + fVar121;
  fVar83 = auVar127._12_4_;
  fStack_16c = fStack_40c + fVar83;
  fStack_168 = fStack_408 + 0.0;
  fStack_164 = fStack_404 + 0.0;
  fStack_160 = fStack_400 + 0.0;
  local_b8 = ZEXT1632(auVar124);
  auVar16 = vsubps_avx(local_b8,auVar256);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_f8,_local_418);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_118._0_4_ = auVar250._0_4_ + auVar276._0_4_;
  local_118._4_4_ = auVar250._4_4_ + auVar276._4_4_;
  local_118._8_4_ = auVar250._8_4_ + auVar276._8_4_;
  local_118._12_4_ = auVar250._12_4_ + auVar276._12_4_;
  local_118._16_4_ = auVar276._16_4_ + 0.0;
  local_118._20_4_ = auVar276._20_4_ + 0.0;
  local_118._24_4_ = auVar276._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar257 = ZEXT1632(auVar250);
  auVar16 = vsubps_avx(auVar257,auVar276);
  _local_418 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar85 = auVar154._0_4_;
  local_158 = fVar85 + local_158;
  fVar60 = auVar154._4_4_;
  fStack_154 = fVar60 + fStack_154;
  fVar228 = auVar154._8_4_;
  fStack_150 = fVar228 + fStack_150;
  fVar133 = auVar154._12_4_;
  fStack_14c = fVar133 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar154),auVar30);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar31._4_4_ = fVar86 * fVar193;
  auVar31._0_4_ = fVar84 * fVar270;
  auVar31._8_4_ = fVar121 * fVar194;
  auVar31._12_4_ = fVar83 * fVar195;
  auVar31._16_4_ = fVar196 * 0.0;
  auVar31._20_4_ = fVar197 * 0.0;
  auVar31._24_4_ = fVar198 * 0.0;
  auVar31._28_4_ = auVar16._28_4_;
  auVar184 = vfnmadd231ps_fma(auVar31,local_b8,auVar80);
  fStack_15c = fVar145 + 0.0;
  auVar32._4_4_ = fStack_174 * fVar193;
  auVar32._0_4_ = local_178 * fVar270;
  auVar32._8_4_ = fStack_170 * fVar194;
  auVar32._12_4_ = fStack_16c * fVar195;
  auVar32._16_4_ = fStack_168 * fVar196;
  auVar32._20_4_ = fStack_164 * fVar197;
  auVar32._24_4_ = fStack_160 * fVar198;
  auVar32._28_4_ = 0;
  auVar212 = vfnmadd231ps_fma(auVar32,auVar80,auVar107);
  auVar33._4_4_ = local_198._4_4_ * fVar193;
  auVar33._0_4_ = local_198._0_4_ * fVar270;
  auVar33._8_4_ = local_198._8_4_ * fVar194;
  auVar33._12_4_ = local_198._12_4_ * fVar195;
  auVar33._16_4_ = local_198._16_4_ * fVar196;
  auVar33._20_4_ = local_198._20_4_ * fVar197;
  auVar33._24_4_ = local_198._24_4_ * fVar198;
  auVar33._28_4_ = fVar145 + 0.0;
  auVar213 = vfnmadd231ps_fma(auVar33,local_d8,auVar80);
  local_658._0_4_ = auVar19._0_4_;
  local_658._4_4_ = auVar19._4_4_;
  uStack_650._0_4_ = auVar19._8_4_;
  uStack_650._4_4_ = auVar19._12_4_;
  uStack_648._0_4_ = auVar19._16_4_;
  uStack_648._4_4_ = auVar19._20_4_;
  uStack_640._0_4_ = auVar19._24_4_;
  uStack_640._4_4_ = auVar19._28_4_;
  auVar34._4_4_ = (float)local_658._4_4_ * fVar193;
  auVar34._0_4_ = (float)local_658._0_4_ * fVar270;
  auVar34._8_4_ = (float)uStack_650 * fVar194;
  auVar34._12_4_ = uStack_650._4_4_ * fVar195;
  auVar34._16_4_ = (float)uStack_648 * fVar196;
  auVar34._20_4_ = uStack_648._4_4_ * fVar197;
  auVar34._24_4_ = (float)uStack_640 * fVar198;
  auVar34._28_4_ = uStack_640._4_4_;
  auVar229 = vfnmadd231ps_fma(auVar34,local_4e8,auVar80);
  auVar209._0_4_ = fVar85 * fVar270;
  auVar209._4_4_ = fVar60 * fVar193;
  auVar209._8_4_ = fVar228 * fVar194;
  auVar209._12_4_ = fVar133 * fVar195;
  auVar209._16_4_ = fVar196 * 0.0;
  auVar209._20_4_ = fVar197 * 0.0;
  auVar209._24_4_ = fVar198 * 0.0;
  auVar209._28_4_ = 0;
  auVar250 = vfnmadd231ps_fma(auVar209,auVar257,auVar80);
  uStack_13c = 0x40400000;
  auVar35._4_4_ = fStack_154 * fVar193;
  auVar35._0_4_ = local_158 * fVar270;
  auVar35._8_4_ = fStack_150 * fVar194;
  auVar35._12_4_ = fStack_14c * fVar195;
  auVar35._16_4_ = fStack_148 * fVar196;
  auVar35._20_4_ = fStack_144 * fVar197;
  auVar35._24_4_ = fStack_140 * fVar198;
  auVar35._28_4_ = local_4e8._28_4_;
  auVar127 = vfnmadd231ps_fma(auVar35,local_118,auVar80);
  auVar36._4_4_ = local_138._4_4_ * fVar193;
  auVar36._0_4_ = local_138._0_4_ * fVar270;
  auVar36._8_4_ = local_138._8_4_ * fVar194;
  auVar36._12_4_ = local_138._12_4_ * fVar195;
  auVar36._16_4_ = local_138._16_4_ * fVar196;
  auVar36._20_4_ = local_138._20_4_ * fVar197;
  auVar36._24_4_ = local_138._24_4_ * fVar198;
  auVar36._28_4_ = local_138._28_4_;
  auVar242 = vfnmadd231ps_fma(auVar36,_local_418,auVar80);
  auVar37._4_4_ = auVar20._4_4_ * fVar193;
  auVar37._0_4_ = auVar20._0_4_ * fVar270;
  auVar37._8_4_ = auVar20._8_4_ * fVar194;
  auVar37._12_4_ = auVar20._12_4_ * fVar195;
  auVar37._16_4_ = auVar20._16_4_ * fVar196;
  auVar37._20_4_ = auVar20._20_4_ * fVar197;
  auVar37._24_4_ = auVar20._24_4_ * fVar198;
  auVar37._28_4_ = auVar79._28_4_ + auVar17._28_4_;
  auVar226 = ZEXT3264(_local_508);
  auVar65 = vfnmadd231ps_fma(auVar37,_local_508,auVar80);
  auVar16 = vminps_avx(ZEXT1632(auVar184),ZEXT1632(auVar212));
  auVar79 = vmaxps_avx(ZEXT1632(auVar184),ZEXT1632(auVar212));
  auVar17 = vminps_avx(ZEXT1632(auVar213),ZEXT1632(auVar229));
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(ZEXT1632(auVar213),ZEXT1632(auVar229));
  auVar79 = vmaxps_avx(auVar79,auVar16);
  auVar18 = vminps_avx(ZEXT1632(auVar250),ZEXT1632(auVar127));
  auVar16 = vmaxps_avx(ZEXT1632(auVar250),ZEXT1632(auVar127));
  auVar11 = vminps_avx(ZEXT1632(auVar242),ZEXT1632(auVar65));
  auVar18 = vminps_avx(auVar18,auVar11);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar242),ZEXT1632(auVar65));
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar79,auVar16);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar79 = vcmpps_avx(auVar18,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar16 = vcmpps_avx(auVar16,auVar45,5);
  auVar79 = vandps_avx(auVar16,auVar79);
  auVar16 = local_1b8 & auVar79;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(local_4e8,local_b8);
    auVar17 = vsubps_avx(_local_508,auVar257);
    fVar270 = auVar16._0_4_ + auVar17._0_4_;
    fVar193 = auVar16._4_4_ + auVar17._4_4_;
    fVar194 = auVar16._8_4_ + auVar17._8_4_;
    fVar195 = auVar16._12_4_ + auVar17._12_4_;
    fVar196 = auVar16._16_4_ + auVar17._16_4_;
    fVar197 = auVar16._20_4_ + auVar17._20_4_;
    fVar198 = auVar16._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(auVar19,local_f8);
    auVar11 = vsubps_avx(auVar20,ZEXT1632(auVar154));
    auVar108._0_4_ = auVar18._0_4_ + auVar11._0_4_;
    auVar108._4_4_ = auVar18._4_4_ + auVar11._4_4_;
    auVar108._8_4_ = auVar18._8_4_ + auVar11._8_4_;
    auVar108._12_4_ = auVar18._12_4_ + auVar11._12_4_;
    auVar108._16_4_ = auVar18._16_4_ + auVar11._16_4_;
    auVar108._20_4_ = auVar18._20_4_ + auVar11._20_4_;
    auVar108._24_4_ = auVar18._24_4_ + auVar11._24_4_;
    fVar145 = auVar11._28_4_;
    auVar108._28_4_ = auVar18._28_4_ + fVar145;
    auVar38._4_4_ = fVar86 * fVar193;
    auVar38._0_4_ = fVar84 * fVar270;
    auVar38._8_4_ = fVar121 * fVar194;
    auVar38._12_4_ = fVar83 * fVar195;
    auVar38._16_4_ = fVar196 * 0.0;
    auVar38._20_4_ = fVar197 * 0.0;
    auVar38._24_4_ = fVar198 * 0.0;
    auVar38._28_4_ = auVar20._28_4_;
    auVar250 = vfnmadd231ps_fma(auVar38,auVar108,local_b8);
    auVar39._4_4_ = fVar193 * fStack_174;
    auVar39._0_4_ = fVar270 * local_178;
    auVar39._8_4_ = fVar194 * fStack_170;
    auVar39._12_4_ = fVar195 * fStack_16c;
    auVar39._16_4_ = fVar196 * fStack_168;
    auVar39._20_4_ = fVar197 * fStack_164;
    auVar39._24_4_ = fVar198 * fStack_160;
    auVar39._28_4_ = 0;
    auVar184 = vfnmadd213ps_fma(auVar107,auVar108,auVar39);
    auVar40._4_4_ = fVar193 * local_198._4_4_;
    auVar40._0_4_ = fVar270 * local_198._0_4_;
    auVar40._8_4_ = fVar194 * local_198._8_4_;
    auVar40._12_4_ = fVar195 * local_198._12_4_;
    auVar40._16_4_ = fVar196 * local_198._16_4_;
    auVar40._20_4_ = fVar197 * local_198._20_4_;
    auVar40._24_4_ = fVar198 * local_198._24_4_;
    auVar40._28_4_ = 0;
    auVar212 = vfnmadd213ps_fma(local_d8,auVar108,auVar40);
    auVar41._4_4_ = (float)local_658._4_4_ * fVar193;
    auVar41._0_4_ = (float)local_658._0_4_ * fVar270;
    auVar41._8_4_ = (float)uStack_650 * fVar194;
    auVar41._12_4_ = uStack_650._4_4_ * fVar195;
    auVar41._16_4_ = (float)uStack_648 * fVar196;
    auVar41._20_4_ = uStack_648._4_4_ * fVar197;
    auVar41._24_4_ = (float)uStack_640 * fVar198;
    auVar41._28_4_ = 0;
    auVar154 = vfnmadd231ps_fma(auVar41,auVar108,local_4e8);
    auVar131._0_4_ = fVar85 * fVar270;
    auVar131._4_4_ = fVar60 * fVar193;
    auVar131._8_4_ = fVar228 * fVar194;
    auVar131._12_4_ = fVar133 * fVar195;
    auVar131._16_4_ = fVar196 * 0.0;
    auVar131._20_4_ = fVar197 * 0.0;
    auVar131._24_4_ = fVar198 * 0.0;
    auVar131._28_4_ = 0;
    auVar127 = vfnmadd231ps_fma(auVar131,auVar108,auVar257);
    auVar42._4_4_ = fVar193 * fStack_154;
    auVar42._0_4_ = fVar270 * local_158;
    auVar42._8_4_ = fVar194 * fStack_150;
    auVar42._12_4_ = fVar195 * fStack_14c;
    auVar42._16_4_ = fVar196 * fStack_148;
    auVar42._20_4_ = fVar197 * fStack_144;
    auVar42._24_4_ = fVar198 * fStack_140;
    auVar42._28_4_ = fVar145;
    auVar213 = vfnmadd213ps_fma(local_118,auVar108,auVar42);
    auVar43._4_4_ = fVar193 * local_138._4_4_;
    auVar43._0_4_ = fVar270 * local_138._0_4_;
    auVar43._8_4_ = fVar194 * local_138._8_4_;
    auVar43._12_4_ = fVar195 * local_138._12_4_;
    auVar43._16_4_ = fVar196 * local_138._16_4_;
    auVar43._20_4_ = fVar197 * local_138._20_4_;
    auVar43._24_4_ = fVar198 * local_138._24_4_;
    auVar43._28_4_ = fVar145;
    auVar229 = vfnmadd213ps_fma(_local_418,auVar108,auVar43);
    auVar226 = ZEXT1664(auVar229);
    auVar44._4_4_ = fVar193 * auVar20._4_4_;
    auVar44._0_4_ = fVar270 * auVar20._0_4_;
    auVar44._8_4_ = fVar194 * auVar20._8_4_;
    auVar44._12_4_ = fVar195 * auVar20._12_4_;
    auVar44._16_4_ = fVar196 * auVar20._16_4_;
    auVar44._20_4_ = fVar197 * auVar20._20_4_;
    auVar44._24_4_ = fVar198 * auVar20._24_4_;
    auVar44._28_4_ = auVar16._28_4_ + auVar17._28_4_;
    auVar242 = vfnmadd231ps_fma(auVar44,auVar108,_local_508);
    auVar17 = vminps_avx(ZEXT1632(auVar250),ZEXT1632(auVar184));
    auVar16 = vmaxps_avx(ZEXT1632(auVar250),ZEXT1632(auVar184));
    auVar18 = vminps_avx(ZEXT1632(auVar212),ZEXT1632(auVar154));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar212),ZEXT1632(auVar154));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar11 = vminps_avx(ZEXT1632(auVar127),ZEXT1632(auVar213));
    auVar17 = vmaxps_avx(ZEXT1632(auVar127),ZEXT1632(auVar213));
    auVar19 = vminps_avx(ZEXT1632(auVar229),ZEXT1632(auVar242));
    auVar11 = vminps_avx(auVar11,auVar19);
    auVar11 = vminps_avx(auVar18,auVar11);
    auVar18 = vmaxps_avx(ZEXT1632(auVar229),ZEXT1632(auVar242));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar11,auVar46,2);
    auVar17 = vcmpps_avx(auVar17,auVar45,5);
    auVar16 = vandps_avx(auVar17,auVar16);
    auVar79 = vandps_avx(auVar79,local_1b8);
    auVar17 = auVar79 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar79 = vandps_avx(auVar16,auVar79);
      uVar52 = vmovmskps_avx(auVar79);
      if (uVar52 != 0) {
        mask_stack[uVar49] = uVar52 & 0xff;
        BVar1 = (BBox1f)vmovlps_avx(auVar9);
        cu_stack[uVar49] = BVar1;
        BVar1 = (BBox1f)vmovlps_avx(auVar66);
        cv_stack[uVar49] = BVar1;
        uVar49 = (ulong)((int)uVar49 + 1);
      }
    }
  }
LAB_0110ac97:
  if ((int)uVar49 != 0) {
    uVar48 = (int)uVar49 - 1;
    uVar52 = mask_stack[uVar48];
    fVar84 = cu_stack[uVar48].lower;
    fVar86 = cu_stack[uVar48].upper;
    iVar21 = 0;
    for (uVar54 = (ulong)uVar52; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      iVar21 = iVar21 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar49 = (ulong)uVar48;
    }
    auVar66._8_8_ = 0;
    auVar66._0_4_ = cv_stack[uVar48].lower;
    auVar66._4_4_ = cv_stack[uVar48].upper;
    mask_stack[uVar48] = uVar52;
    fVar121 = (float)(iVar21 + 1) * 0.14285715;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * (float)iVar21 * 0.14285715)),
                             ZEXT416((uint)fVar84),ZEXT416((uint)(1.0 - (float)iVar21 * 0.14285715))
                            );
    auVar184 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * fVar121)),ZEXT416((uint)fVar84),
                               ZEXT416((uint)(1.0 - fVar121)));
    fVar86 = auVar184._0_4_;
    auVar192._0_4_ = auVar9._0_4_;
    fVar84 = fVar86 - auVar192._0_4_;
    if (fVar84 < 0.16666667) {
      auVar212 = vshufps_avx(auVar66,auVar66,0x50);
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = 0x3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar213 = vsubps_avx(auVar94,auVar212);
      fVar121 = auVar212._0_4_;
      auVar139._0_4_ = fVar121 * fVar134;
      fVar83 = auVar212._4_4_;
      auVar139._4_4_ = fVar83 * fVar258;
      fVar85 = auVar212._8_4_;
      auVar139._8_4_ = fVar85 * fVar134;
      fVar145 = auVar212._12_4_;
      auVar139._12_4_ = fVar145 * fVar258;
      auVar152._0_4_ = fVar121 * fVar268;
      auVar152._4_4_ = fVar83 * fVar269;
      auVar152._8_4_ = fVar85 * fVar268;
      auVar152._12_4_ = fVar145 * fVar269;
      auVar176._0_4_ = fVar121 * fVar199;
      auVar176._4_4_ = fVar83 * fVar210;
      auVar176._8_4_ = fVar85 * fVar199;
      auVar176._12_4_ = fVar145 * fVar210;
      auVar68._0_4_ = fVar121 * fVar211;
      auVar68._4_4_ = fVar83 * fVar227;
      auVar68._8_4_ = fVar85 * fVar211;
      auVar68._12_4_ = fVar145 * fVar227;
      auVar212 = vfmadd231ps_fma(auVar139,auVar213,auVar187);
      auVar229 = vfmadd231ps_fma(auVar152,auVar213,auVar232);
      auVar250 = vfmadd231ps_fma(auVar176,auVar213,auVar249);
      auVar213 = vfmadd231ps_fma(auVar68,auVar213,auVar261);
      auVar132._16_16_ = auVar212;
      auVar132._0_16_ = auVar212;
      auVar144._16_16_ = auVar229;
      auVar144._0_16_ = auVar229;
      auVar161._16_16_ = auVar250;
      auVar161._0_16_ = auVar250;
      auVar192._4_4_ = auVar192._0_4_;
      auVar192._8_4_ = auVar192._0_4_;
      auVar192._12_4_ = auVar192._0_4_;
      auVar192._20_4_ = fVar86;
      auVar192._16_4_ = fVar86;
      auVar192._24_4_ = fVar86;
      auVar192._28_4_ = fVar86;
      auVar79 = vsubps_avx(auVar144,auVar132);
      auVar229 = vfmadd213ps_fma(auVar79,auVar192,auVar132);
      auVar79 = vsubps_avx(auVar161,auVar144);
      auVar154 = vfmadd213ps_fma(auVar79,auVar192,auVar144);
      auVar212 = vsubps_avx(auVar213,auVar250);
      auVar81._16_16_ = auVar212;
      auVar81._0_16_ = auVar212;
      auVar212 = vfmadd213ps_fma(auVar81,auVar192,auVar161);
      auVar79 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar229));
      auVar213 = vfmadd213ps_fma(auVar79,auVar192,ZEXT1632(auVar229));
      auVar79 = vsubps_avx(ZEXT1632(auVar212),ZEXT1632(auVar154));
      auVar212 = vfmadd213ps_fma(auVar79,auVar192,ZEXT1632(auVar154));
      auVar79 = vsubps_avx(ZEXT1632(auVar212),ZEXT1632(auVar213));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar79,auVar192);
      fVar228 = auVar79._4_4_ * 3.0;
      local_4e8._0_4_ = fVar84;
      fVar121 = fVar84 * 0.33333334;
      auVar95._0_8_ =
           CONCAT44(auVar65._4_4_ + fVar121 * fVar228,auVar65._0_4_ + fVar121 * auVar79._0_4_ * 3.0)
      ;
      auVar95._8_4_ = auVar65._8_4_ + fVar121 * auVar79._8_4_ * 3.0;
      auVar95._12_4_ = auVar65._12_4_ + fVar121 * auVar79._12_4_ * 3.0;
      auVar213 = vshufpd_avx(auVar65,auVar65,3);
      auVar229 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_508 = auVar213;
      auVar212 = vsubps_avx(auVar213,auVar65);
      auVar250 = vsubps_avx(auVar229,(undefined1  [16])0x0);
      auVar69._0_4_ = auVar212._0_4_ + auVar250._0_4_;
      auVar69._4_4_ = auVar212._4_4_ + auVar250._4_4_;
      auVar69._8_4_ = auVar212._8_4_ + auVar250._8_4_;
      auVar69._12_4_ = auVar212._12_4_ + auVar250._12_4_;
      auVar212 = vshufps_avx(auVar65,auVar65,0xb1);
      auVar250 = vshufps_avx(auVar95,auVar95,0xb1);
      auVar272._4_4_ = auVar69._0_4_;
      auVar272._0_4_ = auVar69._0_4_;
      auVar272._8_4_ = auVar69._0_4_;
      auVar272._12_4_ = auVar69._0_4_;
      auVar154 = vshufps_avx(auVar69,auVar69,0x55);
      fVar83 = auVar154._0_4_;
      auVar70._0_4_ = fVar83 * auVar212._0_4_;
      fVar85 = auVar154._4_4_;
      auVar70._4_4_ = fVar85 * auVar212._4_4_;
      fVar145 = auVar154._8_4_;
      auVar70._8_4_ = fVar145 * auVar212._8_4_;
      fVar60 = auVar154._12_4_;
      auVar70._12_4_ = fVar60 * auVar212._12_4_;
      auVar153._0_4_ = fVar83 * auVar250._0_4_;
      auVar153._4_4_ = fVar85 * auVar250._4_4_;
      auVar153._8_4_ = fVar145 * auVar250._8_4_;
      auVar153._12_4_ = fVar60 * auVar250._12_4_;
      auVar127 = vfmadd231ps_fma(auVar70,auVar272,auVar65);
      auVar242 = vfmadd231ps_fma(auVar153,auVar272,auVar95);
      auVar250 = vshufps_avx(auVar127,auVar127,0xe8);
      auVar154 = vshufps_avx(auVar242,auVar242,0xe8);
      auVar212 = vcmpps_avx(auVar250,auVar154,1);
      uVar52 = vextractps_avx(auVar212,0);
      auVar91 = auVar242;
      if ((uVar52 & 1) == 0) {
        auVar91 = auVar127;
      }
      auVar123._0_4_ = fVar121 * auVar79._16_4_ * 3.0;
      auVar123._4_4_ = fVar121 * fVar228;
      auVar123._8_4_ = fVar121 * auVar79._24_4_ * 3.0;
      auVar123._12_4_ = fVar121 * auVar226._28_4_;
      auVar110 = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(auVar110,auVar110,0xb1);
      auVar92 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar188._0_4_ = fVar83 * auVar124._0_4_;
      auVar188._4_4_ = fVar85 * auVar124._4_4_;
      auVar188._8_4_ = fVar145 * auVar124._8_4_;
      auVar188._12_4_ = fVar60 * auVar124._12_4_;
      auVar203._0_4_ = auVar92._0_4_ * fVar83;
      auVar203._4_4_ = auVar92._4_4_ * fVar85;
      auVar203._8_4_ = auVar92._8_4_ * fVar145;
      auVar203._12_4_ = auVar92._12_4_ * fVar60;
      _local_418 = auVar110;
      auVar137 = vfmadd231ps_fma(auVar188,auVar272,auVar110);
      auVar149 = vfmadd231ps_fma(auVar203,(undefined1  [16])0x0,auVar272);
      auVar92 = vshufps_avx(auVar137,auVar137,0xe8);
      auVar93 = vshufps_avx(auVar149,auVar149,0xe8);
      auVar226 = ZEXT1664(auVar93);
      auVar124 = vcmpps_avx(auVar92,auVar93,1);
      uVar52 = vextractps_avx(auVar124,0);
      auVar150 = auVar149;
      if ((uVar52 & 1) == 0) {
        auVar150 = auVar137;
      }
      auVar91 = vmaxss_avx(auVar150,auVar91);
      auVar250 = vminps_avx(auVar250,auVar154);
      auVar154 = vminps_avx(auVar92,auVar93);
      auVar154 = vminps_avx(auVar250,auVar154);
      auVar212 = vshufps_avx(auVar212,auVar212,0x55);
      auVar212 = vblendps_avx(auVar212,auVar124,2);
      auVar124 = vpslld_avx(auVar212,0x1f);
      auVar212 = vshufpd_avx(auVar242,auVar242,1);
      auVar212 = vinsertps_avx(auVar212,auVar149,0x9c);
      auVar250 = vshufpd_avx(auVar127,auVar127,1);
      auVar250 = vinsertps_avx(auVar250,auVar137,0x9c);
      auVar212 = vblendvps_avx(auVar250,auVar212,auVar124);
      auVar250 = vmovshdup_avx(auVar212);
      auVar212 = vmaxss_avx(auVar250,auVar212);
      fVar145 = auVar154._0_4_;
      auVar250 = vmovshdup_avx(auVar154);
      fVar85 = auVar212._0_4_;
      fVar121 = auVar250._0_4_;
      fVar83 = auVar91._0_4_;
      if (((0.0001 <= fVar145) || (fVar85 <= -0.0001)) && (0.0001 <= fVar121 || fVar85 <= -0.0001))
      goto code_r0x0110af9d;
      goto LAB_0110afc3;
    }
    auVar9 = vinsertps_avx(auVar9,auVar184,0x10);
    goto LAB_0110a6e9;
  }
  if (bVar55) goto LAB_0110bb4a;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar78._4_4_ = uVar59;
  auVar78._0_4_ = uVar59;
  auVar78._8_4_ = uVar59;
  auVar78._12_4_ = uVar59;
  auVar9 = vcmpps_avx(auVar200,auVar78,2);
  uVar53 = vmovmskps_avx(auVar9);
  uVar53 = (uint)uVar56 & uVar53;
  goto LAB_01109f29;
code_r0x0110af9d:
  auVar250 = vcmpps_avx(auVar250,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar127 = vcmpps_avx(auVar154,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar250 = vandps_avx(auVar127,auVar250);
  if (fVar83 <= -0.0001 || (auVar250 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0110ac97;
LAB_0110afc3:
  auVar127 = vcmpps_avx(auVar154,_DAT_01f45a50,1);
  auVar242 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar250 = vcmpss_avx(auVar91,ZEXT816(0) << 0x20,1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar250 = vblendvps_avx(auVar96,auVar112,auVar250);
  auVar127 = vblendvps_avx(auVar96,auVar112,auVar127);
  fVar228 = auVar127._0_4_;
  fVar60 = auVar250._0_4_;
  auVar250 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar228 == fVar60) && (!NAN(fVar228) && !NAN(fVar60))) {
    auVar250 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar228 == fVar60) && (!NAN(fVar228) && !NAN(fVar60))) {
    auVar242 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar127 = vmovshdup_avx(auVar127);
  fVar133 = auVar127._0_4_;
  if ((fVar228 != fVar133) || (NAN(fVar228) || NAN(fVar133))) {
    if ((fVar121 != fVar145) || (NAN(fVar121) || NAN(fVar145))) {
      auVar125._0_4_ = (float)((uint)fVar145 ^ local_438);
      auVar125._4_4_ = auVar154._4_4_ ^ uStack_434;
      auVar125._8_4_ = auVar154._8_4_ ^ uStack_430;
      auVar125._12_4_ = auVar154._12_4_ ^ uStack_42c;
      auVar126._0_4_ = auVar125._0_4_ / (fVar121 - fVar145);
      auVar126._4_12_ = auVar125._4_12_;
      auVar154 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
      auVar127 = auVar154;
    }
    else {
      auVar154 = ZEXT816(0) << 0x20;
      if ((fVar145 != 0.0) || (auVar127 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar145))) {
        auVar154 = SUB6416(ZEXT464(0x7f800000),0);
        auVar127 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar250 = vminss_avx(auVar250,auVar154);
    auVar242 = vmaxss_avx(auVar127,auVar242);
  }
  auVar212 = vcmpss_avx(auVar212,ZEXT416(0),1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar212 = vblendvps_avx(auVar97,auVar113,auVar212);
  fVar121 = auVar212._0_4_;
  if ((fVar60 != fVar121) || (NAN(fVar60) || NAN(fVar121))) {
    if ((fVar85 != fVar83) || (NAN(fVar85) || NAN(fVar83))) {
      auVar71._0_4_ = (float)((uint)fVar83 ^ local_438);
      auVar71._4_4_ = auVar91._4_4_ ^ uStack_434;
      auVar71._8_4_ = auVar91._8_4_ ^ uStack_430;
      auVar71._12_4_ = auVar91._12_4_ ^ uStack_42c;
      auVar128._0_4_ = auVar71._0_4_ / (fVar85 - fVar83);
      auVar128._4_12_ = auVar71._4_12_;
      auVar212 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar154 = auVar212;
    }
    else {
      auVar212 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar83 != 0.0) || (auVar154 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar83))) {
        auVar212 = SUB6416(ZEXT464(0xff800000),0);
        auVar154 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar250 = vminss_avx(auVar250,auVar154);
    auVar242 = vmaxss_avx(auVar212,auVar242);
  }
  if ((fVar133 != fVar121) || (NAN(fVar133) || NAN(fVar121))) {
    auVar250 = vminss_avx(auVar250,SUB6416(ZEXT464(0x3f800000),0));
    auVar242 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar242);
  }
  auVar212 = vmaxss_avx(ZEXT816(0) << 0x40,auVar250);
  auVar250 = vminss_avx(auVar242,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar250._0_4_ < auVar212._0_4_) goto LAB_0110ac97;
  auVar212 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar212._0_4_ + -0.1)));
  auVar250 = vminss_avx(ZEXT416((uint)(auVar250._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar140._0_8_ = auVar65._0_8_;
  auVar140._8_8_ = auVar140._0_8_;
  auVar218._8_8_ = auVar95._0_8_;
  auVar218._0_8_ = auVar95._0_8_;
  auVar233._8_8_ = auVar110._0_8_;
  auVar233._0_8_ = auVar110._0_8_;
  auVar154 = vshufpd_avx(auVar95,auVar95,3);
  auVar127 = vshufpd_avx(auVar110,auVar110,3);
  auVar242 = vshufps_avx(auVar212,auVar250,0);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar65 = vsubps_avx(auVar72,auVar242);
  local_508._0_4_ = auVar213._0_4_;
  local_508._4_4_ = auVar213._4_4_;
  fStack_500 = auVar213._8_4_;
  fStack_4fc = auVar213._12_4_;
  fVar121 = auVar242._0_4_;
  auVar73._0_4_ = fVar121 * (float)local_508._0_4_;
  fVar83 = auVar242._4_4_;
  auVar73._4_4_ = fVar83 * (float)local_508._4_4_;
  fVar85 = auVar242._8_4_;
  auVar73._8_4_ = fVar85 * fStack_500;
  fVar145 = auVar242._12_4_;
  auVar73._12_4_ = fVar145 * fStack_4fc;
  auVar177._0_4_ = fVar121 * auVar154._0_4_;
  auVar177._4_4_ = fVar83 * auVar154._4_4_;
  auVar177._8_4_ = fVar85 * auVar154._8_4_;
  auVar177._12_4_ = fVar145 * auVar154._12_4_;
  auVar189._0_4_ = fVar121 * auVar127._0_4_;
  auVar189._4_4_ = fVar83 * auVar127._4_4_;
  auVar189._8_4_ = fVar85 * auVar127._8_4_;
  auVar189._12_4_ = fVar145 * auVar127._12_4_;
  auVar204._0_4_ = fVar121 * auVar229._0_4_;
  auVar204._4_4_ = fVar83 * auVar229._4_4_;
  auVar204._8_4_ = fVar85 * auVar229._8_4_;
  auVar204._12_4_ = fVar145 * auVar229._12_4_;
  auVar154 = vfmadd231ps_fma(auVar73,auVar65,auVar140);
  auVar127 = vfmadd231ps_fma(auVar177,auVar65,auVar218);
  auVar242 = vfmadd231ps_fma(auVar189,auVar65,auVar233);
  auVar65 = vfmadd231ps_fma(auVar204,auVar65,ZEXT816(0));
  auVar213 = vmovshdup_avx(auVar66);
  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ * auVar212._0_4_)),auVar66,
                            ZEXT416((uint)(1.0 - auVar212._0_4_)));
  auVar110 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ * auVar250._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar250._0_4_)));
  fVar121 = 1.0 / fVar84;
  auVar212 = vsubps_avx(auVar127,auVar154);
  auVar219._0_4_ = auVar212._0_4_ * 3.0;
  auVar219._4_4_ = auVar212._4_4_ * 3.0;
  auVar219._8_4_ = auVar212._8_4_ * 3.0;
  auVar219._12_4_ = auVar212._12_4_ * 3.0;
  auVar212 = vsubps_avx(auVar242,auVar127);
  auVar234._0_4_ = auVar212._0_4_ * 3.0;
  auVar234._4_4_ = auVar212._4_4_ * 3.0;
  auVar234._8_4_ = auVar212._8_4_ * 3.0;
  auVar234._12_4_ = auVar212._12_4_ * 3.0;
  auVar212 = vsubps_avx(auVar65,auVar242);
  auVar243._0_4_ = auVar212._0_4_ * 3.0;
  auVar243._4_4_ = auVar212._4_4_ * 3.0;
  auVar243._8_4_ = auVar212._8_4_ * 3.0;
  auVar243._12_4_ = auVar212._12_4_ * 3.0;
  auVar213 = vminps_avx(auVar234,auVar243);
  auVar212 = vmaxps_avx(auVar234,auVar243);
  auVar213 = vminps_avx(auVar219,auVar213);
  auVar212 = vmaxps_avx(auVar219,auVar212);
  auVar229 = vshufpd_avx(auVar213,auVar213,3);
  auVar250 = vshufpd_avx(auVar212,auVar212,3);
  auVar213 = vminps_avx(auVar213,auVar229);
  auVar212 = vmaxps_avx(auVar212,auVar250);
  auVar235._0_4_ = auVar213._0_4_ * fVar121;
  auVar235._4_4_ = auVar213._4_4_ * fVar121;
  auVar235._8_4_ = auVar213._8_4_ * fVar121;
  auVar235._12_4_ = auVar213._12_4_ * fVar121;
  auVar220._0_4_ = auVar212._0_4_ * fVar121;
  auVar220._4_4_ = auVar212._4_4_ * fVar121;
  auVar220._8_4_ = auVar212._8_4_ * fVar121;
  auVar220._12_4_ = auVar212._12_4_ * fVar121;
  fVar121 = 1.0 / (auVar110._0_4_ - auVar93._0_4_);
  auVar212 = vshufpd_avx(auVar154,auVar154,3);
  auVar213 = vshufpd_avx(auVar127,auVar127,3);
  auVar229 = vshufpd_avx(auVar242,auVar242,3);
  auVar250 = vshufpd_avx(auVar65,auVar65,3);
  auVar212 = vsubps_avx(auVar212,auVar154);
  auVar154 = vsubps_avx(auVar213,auVar127);
  auVar66 = vsubps_avx(auVar229,auVar242);
  auVar250 = vsubps_avx(auVar250,auVar65);
  auVar213 = vminps_avx(auVar212,auVar154);
  auVar212 = vmaxps_avx(auVar212,auVar154);
  auVar229 = vminps_avx(auVar66,auVar250);
  auVar229 = vminps_avx(auVar213,auVar229);
  auVar213 = vmaxps_avx(auVar66,auVar250);
  auVar212 = vmaxps_avx(auVar212,auVar213);
  auVar262._0_4_ = fVar121 * auVar229._0_4_;
  auVar262._4_4_ = fVar121 * auVar229._4_4_;
  auVar262._8_4_ = fVar121 * auVar229._8_4_;
  auVar262._12_4_ = fVar121 * auVar229._12_4_;
  auVar251._0_4_ = fVar121 * auVar212._0_4_;
  auVar251._4_4_ = fVar121 * auVar212._4_4_;
  auVar251._8_4_ = fVar121 * auVar212._8_4_;
  auVar251._12_4_ = fVar121 * auVar212._12_4_;
  auVar250 = vinsertps_avx(auVar9,auVar93,0x10);
  auVar154 = vinsertps_avx(auVar184,auVar110,0x10);
  auVar244._0_4_ = (auVar250._0_4_ + auVar154._0_4_) * 0.5;
  auVar244._4_4_ = (auVar250._4_4_ + auVar154._4_4_) * 0.5;
  auVar244._8_4_ = (auVar250._8_4_ + auVar154._8_4_) * 0.5;
  auVar244._12_4_ = (auVar250._12_4_ + auVar154._12_4_) * 0.5;
  auVar74._4_4_ = auVar244._0_4_;
  auVar74._0_4_ = auVar244._0_4_;
  auVar74._8_4_ = auVar244._0_4_;
  auVar74._12_4_ = auVar244._0_4_;
  auVar212 = vfmadd213ps_fma(auVar10,auVar74,auVar13);
  auVar213 = vfmadd213ps_fma(auVar12,auVar74,auVar14);
  auVar229 = vfmadd213ps_fma(auVar136,auVar74,auVar15);
  auVar184 = vsubps_avx(auVar213,auVar212);
  auVar212 = vfmadd213ps_fma(auVar184,auVar74,auVar212);
  auVar184 = vsubps_avx(auVar229,auVar213);
  auVar184 = vfmadd213ps_fma(auVar184,auVar74,auVar213);
  auVar184 = vsubps_avx(auVar184,auVar212);
  auVar212 = vfmadd231ps_fma(auVar212,auVar184,auVar74);
  auVar75._0_8_ = CONCAT44(auVar184._4_4_ * 3.0,auVar184._0_4_ * 3.0);
  auVar75._8_4_ = auVar184._8_4_ * 3.0;
  auVar75._12_4_ = auVar184._12_4_ * 3.0;
  auVar273._8_8_ = auVar212._0_8_;
  auVar273._0_8_ = auVar212._0_8_;
  auVar184 = vshufpd_avx(auVar212,auVar212,3);
  auVar212 = vshufps_avx(auVar244,auVar244,0x55);
  auVar127 = vsubps_avx(auVar184,auVar273);
  auVar65 = vfmadd231ps_fma(auVar273,auVar212,auVar127);
  auVar279._8_8_ = auVar75._0_8_;
  auVar279._0_8_ = auVar75._0_8_;
  auVar184 = vshufpd_avx(auVar75,auVar75,3);
  auVar184 = vsubps_avx(auVar184,auVar279);
  auVar242 = vfmadd213ps_fma(auVar184,auVar212,auVar279);
  auVar212 = vmovshdup_avx(auVar242);
  auVar280._0_8_ = auVar212._0_8_ ^ 0x8000000080000000;
  auVar280._8_4_ = auVar212._8_4_ ^ 0x80000000;
  auVar280._12_4_ = auVar212._12_4_ ^ 0x80000000;
  auVar213 = vmovshdup_avx(auVar127);
  auVar184 = vunpcklps_avx(auVar213,auVar280);
  auVar229 = vshufps_avx(auVar184,auVar280,4);
  auVar66 = vshufps_avx(auVar244,auVar244,0x54);
  auVar129._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
  auVar129._8_4_ = auVar127._8_4_ ^ 0x80000000;
  auVar129._12_4_ = auVar127._12_4_ ^ 0x80000000;
  auVar184 = vmovlhps_avx(auVar129,auVar242);
  auVar184 = vshufps_avx(auVar184,auVar242,8);
  auVar212 = vfmsub231ss_fma(ZEXT416((uint)(auVar127._0_4_ * auVar212._0_4_)),auVar213,auVar242);
  uVar59 = auVar212._0_4_;
  auVar76._4_4_ = uVar59;
  auVar76._0_4_ = uVar59;
  auVar76._8_4_ = uVar59;
  auVar76._12_4_ = uVar59;
  auVar212 = vdivps_avx(auVar229,auVar76);
  auVar213 = vdivps_avx(auVar184,auVar76);
  fVar85 = auVar65._0_4_;
  fVar121 = auVar212._0_4_;
  auVar184 = vshufps_avx(auVar65,auVar65,0x55);
  fVar83 = auVar213._0_4_;
  auVar77._0_4_ = fVar85 * fVar121 + auVar184._0_4_ * fVar83;
  auVar77._4_4_ = fVar85 * auVar212._4_4_ + auVar184._4_4_ * auVar213._4_4_;
  auVar77._8_4_ = fVar85 * auVar212._8_4_ + auVar184._8_4_ * auVar213._8_4_;
  auVar77._12_4_ = fVar85 * auVar212._12_4_ + auVar184._12_4_ * auVar213._12_4_;
  auVar92 = vsubps_avx(auVar66,auVar77);
  auVar66 = vmovshdup_avx(auVar212);
  auVar184 = vinsertps_avx(auVar235,auVar262,0x1c);
  auVar155._0_4_ = auVar66._0_4_ * auVar184._0_4_;
  auVar155._4_4_ = auVar66._4_4_ * auVar184._4_4_;
  auVar155._8_4_ = auVar66._8_4_ * auVar184._8_4_;
  auVar155._12_4_ = auVar66._12_4_ * auVar184._12_4_;
  auVar229 = vinsertps_avx(auVar220,auVar251,0x1c);
  auVar98._0_4_ = auVar229._0_4_ * auVar66._0_4_;
  auVar98._4_4_ = auVar229._4_4_ * auVar66._4_4_;
  auVar98._8_4_ = auVar229._8_4_ * auVar66._8_4_;
  auVar98._12_4_ = auVar229._12_4_ * auVar66._12_4_;
  auVar65 = vminps_avx(auVar155,auVar98);
  auVar242 = vmaxps_avx(auVar98,auVar155);
  auVar66 = vinsertps_avx(auVar262,auVar235,0x4c);
  auVar91 = vmovshdup_avx(auVar213);
  auVar127 = vinsertps_avx(auVar251,auVar220,0x4c);
  auVar252._0_4_ = auVar91._0_4_ * auVar66._0_4_;
  auVar252._4_4_ = auVar91._4_4_ * auVar66._4_4_;
  auVar252._8_4_ = auVar91._8_4_ * auVar66._8_4_;
  auVar252._12_4_ = auVar91._12_4_ * auVar66._12_4_;
  auVar236._0_4_ = auVar91._0_4_ * auVar127._0_4_;
  auVar236._4_4_ = auVar91._4_4_ * auVar127._4_4_;
  auVar236._8_4_ = auVar91._8_4_ * auVar127._8_4_;
  auVar236._12_4_ = auVar91._12_4_ * auVar127._12_4_;
  auVar91 = vminps_avx(auVar252,auVar236);
  auVar263._0_4_ = auVar65._0_4_ + auVar91._0_4_;
  auVar263._4_4_ = auVar65._4_4_ + auVar91._4_4_;
  auVar263._8_4_ = auVar65._8_4_ + auVar91._8_4_;
  auVar263._12_4_ = auVar65._12_4_ + auVar91._12_4_;
  auVar65 = vmaxps_avx(auVar236,auVar252);
  auVar99._0_4_ = auVar65._0_4_ + auVar242._0_4_;
  auVar99._4_4_ = auVar65._4_4_ + auVar242._4_4_;
  auVar99._8_4_ = auVar65._8_4_ + auVar242._8_4_;
  auVar99._12_4_ = auVar65._12_4_ + auVar242._12_4_;
  auVar237._8_8_ = 0x3f80000000000000;
  auVar237._0_8_ = 0x3f80000000000000;
  auVar242 = vsubps_avx(auVar237,auVar99);
  auVar65 = vsubps_avx(auVar237,auVar263);
  auVar91 = vsubps_avx(auVar250,auVar244);
  auVar124 = vsubps_avx(auVar154,auVar244);
  auVar114._0_4_ = fVar121 * auVar184._0_4_;
  auVar114._4_4_ = fVar121 * auVar184._4_4_;
  auVar114._8_4_ = fVar121 * auVar184._8_4_;
  auVar114._12_4_ = fVar121 * auVar184._12_4_;
  auVar264._0_4_ = fVar121 * auVar229._0_4_;
  auVar264._4_4_ = fVar121 * auVar229._4_4_;
  auVar264._8_4_ = fVar121 * auVar229._8_4_;
  auVar264._12_4_ = fVar121 * auVar229._12_4_;
  auVar229 = vminps_avx(auVar114,auVar264);
  auVar184 = vmaxps_avx(auVar264,auVar114);
  auVar156._0_4_ = fVar83 * auVar66._0_4_;
  auVar156._4_4_ = fVar83 * auVar66._4_4_;
  auVar156._8_4_ = fVar83 * auVar66._8_4_;
  auVar156._12_4_ = fVar83 * auVar66._12_4_;
  auVar221._0_4_ = fVar83 * auVar127._0_4_;
  auVar221._4_4_ = fVar83 * auVar127._4_4_;
  auVar221._8_4_ = fVar83 * auVar127._8_4_;
  auVar221._12_4_ = fVar83 * auVar127._12_4_;
  auVar66 = vminps_avx(auVar156,auVar221);
  auVar265._0_4_ = auVar229._0_4_ + auVar66._0_4_;
  auVar265._4_4_ = auVar229._4_4_ + auVar66._4_4_;
  auVar265._8_4_ = auVar229._8_4_ + auVar66._8_4_;
  auVar265._12_4_ = auVar229._12_4_ + auVar66._12_4_;
  fVar133 = auVar91._0_4_;
  auVar274._0_4_ = fVar133 * auVar242._0_4_;
  fVar270 = auVar91._4_4_;
  auVar274._4_4_ = fVar270 * auVar242._4_4_;
  fVar193 = auVar91._8_4_;
  auVar274._8_4_ = fVar193 * auVar242._8_4_;
  fVar194 = auVar91._12_4_;
  auVar274._12_4_ = fVar194 * auVar242._12_4_;
  auVar229 = vmaxps_avx(auVar221,auVar156);
  auVar222._0_4_ = fVar133 * auVar65._0_4_;
  auVar222._4_4_ = fVar270 * auVar65._4_4_;
  auVar222._8_4_ = fVar193 * auVar65._8_4_;
  auVar222._12_4_ = fVar194 * auVar65._12_4_;
  fVar85 = auVar124._0_4_;
  auVar100._0_4_ = fVar85 * auVar242._0_4_;
  fVar145 = auVar124._4_4_;
  auVar100._4_4_ = fVar145 * auVar242._4_4_;
  fVar60 = auVar124._8_4_;
  auVar100._8_4_ = fVar60 * auVar242._8_4_;
  fVar228 = auVar124._12_4_;
  auVar100._12_4_ = fVar228 * auVar242._12_4_;
  auVar238._0_4_ = fVar85 * auVar65._0_4_;
  auVar238._4_4_ = fVar145 * auVar65._4_4_;
  auVar238._8_4_ = fVar60 * auVar65._8_4_;
  auVar238._12_4_ = fVar228 * auVar65._12_4_;
  auVar115._0_4_ = auVar184._0_4_ + auVar229._0_4_;
  auVar115._4_4_ = auVar184._4_4_ + auVar229._4_4_;
  auVar115._8_4_ = auVar184._8_4_ + auVar229._8_4_;
  auVar115._12_4_ = auVar184._12_4_ + auVar229._12_4_;
  auVar157._8_8_ = 0x3f800000;
  auVar157._0_8_ = 0x3f800000;
  auVar184 = vsubps_avx(auVar157,auVar115);
  auVar229 = vsubps_avx(auVar157,auVar265);
  auVar266._0_4_ = fVar133 * auVar184._0_4_;
  auVar266._4_4_ = fVar270 * auVar184._4_4_;
  auVar266._8_4_ = fVar193 * auVar184._8_4_;
  auVar266._12_4_ = fVar194 * auVar184._12_4_;
  auVar253._0_4_ = fVar133 * auVar229._0_4_;
  auVar253._4_4_ = fVar270 * auVar229._4_4_;
  auVar253._8_4_ = fVar193 * auVar229._8_4_;
  auVar253._12_4_ = fVar194 * auVar229._12_4_;
  auVar116._0_4_ = fVar85 * auVar184._0_4_;
  auVar116._4_4_ = fVar145 * auVar184._4_4_;
  auVar116._8_4_ = fVar60 * auVar184._8_4_;
  auVar116._12_4_ = fVar228 * auVar184._12_4_;
  auVar158._0_4_ = fVar85 * auVar229._0_4_;
  auVar158._4_4_ = fVar145 * auVar229._4_4_;
  auVar158._8_4_ = fVar60 * auVar229._8_4_;
  auVar158._12_4_ = fVar228 * auVar229._12_4_;
  auVar184 = vminps_avx(auVar266,auVar253);
  auVar229 = vminps_avx(auVar116,auVar158);
  auVar184 = vminps_avx(auVar184,auVar229);
  auVar229 = vmaxps_avx(auVar253,auVar266);
  auVar66 = vmaxps_avx(auVar158,auVar116);
  auVar127 = vminps_avx(auVar274,auVar222);
  auVar242 = vminps_avx(auVar100,auVar238);
  auVar127 = vminps_avx(auVar127,auVar242);
  auVar184 = vhaddps_avx(auVar184,auVar127);
  auVar229 = vmaxps_avx(auVar66,auVar229);
  auVar66 = vmaxps_avx(auVar222,auVar274);
  auVar127 = vmaxps_avx(auVar238,auVar100);
  auVar66 = vmaxps_avx(auVar127,auVar66);
  auVar229 = vhaddps_avx(auVar229,auVar66);
  auVar184 = vshufps_avx(auVar184,auVar184,0xe8);
  auVar229 = vshufps_avx(auVar229,auVar229,0xe8);
  auVar239._0_4_ = auVar92._0_4_ + auVar184._0_4_;
  auVar239._4_4_ = auVar92._4_4_ + auVar184._4_4_;
  auVar239._8_4_ = auVar92._8_4_ + auVar184._8_4_;
  auVar239._12_4_ = auVar92._12_4_ + auVar184._12_4_;
  auVar223._0_4_ = auVar92._0_4_ + auVar229._0_4_;
  auVar223._4_4_ = auVar92._4_4_ + auVar229._4_4_;
  auVar223._8_4_ = auVar92._8_4_ + auVar229._8_4_;
  auVar223._12_4_ = auVar92._12_4_ + auVar229._12_4_;
  auVar226 = ZEXT1664(auVar223);
  auVar184 = vmaxps_avx(auVar250,auVar239);
  auVar229 = vminps_avx(auVar223,auVar154);
  auVar184 = vcmpps_avx(auVar229,auVar184,1);
  auVar184 = vshufps_avx(auVar184,auVar184,0x50);
  if ((auVar184 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar184[0xf] < '\0')
  goto LAB_0110ac97;
  bVar51 = 0;
  if ((auVar192._0_4_ < auVar239._0_4_) && (bVar51 = 0, auVar223._0_4_ < auVar154._0_4_)) {
    auVar229 = vmovshdup_avx(auVar239);
    auVar184 = vcmpps_avx(auVar223,auVar154,1);
    bVar51 = auVar184[4] & auVar93._0_4_ < auVar229._0_4_;
  }
  auVar226 = ZEXT464(0x40400000);
  p03.field_0.i[0] = auVar64._0_4_;
  p03.field_0.i[1] = auVar64._4_4_;
  p03.field_0.i[2] = auVar64._8_4_;
  p03.field_0.i[3] = auVar64._12_4_;
  if (((3 < (uint)uVar49 || fVar84 < 0.001) | bVar51) == 1) {
    lVar50 = 0xc9;
    do {
      lVar50 = lVar50 + -1;
      if (lVar50 == 0) goto LAB_0110ac97;
      fVar145 = auVar92._0_4_;
      fVar85 = 1.0 - fVar145;
      fVar84 = fVar85 * fVar85 * fVar85;
      fVar86 = fVar145 * 3.0 * fVar85 * fVar85;
      fVar85 = fVar85 * fVar145 * fVar145 * 3.0;
      auVar141._4_4_ = fVar84;
      auVar141._0_4_ = fVar84;
      auVar141._8_4_ = fVar84;
      auVar141._12_4_ = fVar84;
      auVar117._4_4_ = fVar86;
      auVar117._0_4_ = fVar86;
      auVar117._8_4_ = fVar86;
      auVar117._12_4_ = fVar86;
      auVar101._4_4_ = fVar85;
      auVar101._0_4_ = fVar85;
      auVar101._8_4_ = fVar85;
      auVar101._12_4_ = fVar85;
      fVar145 = fVar145 * fVar145 * fVar145;
      auVar159._0_4_ = p03.field_0.v[0] * fVar145;
      auVar159._4_4_ = p03.field_0.v[1] * fVar145;
      auVar159._8_4_ = p03.field_0.v[2] * fVar145;
      auVar159._12_4_ = p03.field_0.v[3] * fVar145;
      auVar9 = vfmadd231ps_fma(auVar159,auVar15,auVar101);
      auVar9 = vfmadd231ps_fma(auVar9,auVar14,auVar117);
      auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar141);
      auVar102._8_8_ = auVar9._0_8_;
      auVar102._0_8_ = auVar9._0_8_;
      auVar9 = vshufpd_avx(auVar9,auVar9,3);
      auVar184 = vshufps_avx(auVar92,auVar92,0x55);
      auVar9 = vsubps_avx(auVar9,auVar102);
      auVar184 = vfmadd213ps_fma(auVar9,auVar184,auVar102);
      fVar84 = auVar184._0_4_;
      auVar9 = vshufps_avx(auVar184,auVar184,0x55);
      auVar103._0_4_ = fVar121 * fVar84 + fVar83 * auVar9._0_4_;
      auVar103._4_4_ = auVar212._4_4_ * fVar84 + auVar213._4_4_ * auVar9._4_4_;
      auVar103._8_4_ = auVar212._8_4_ * fVar84 + auVar213._8_4_ * auVar9._8_4_;
      auVar103._12_4_ = auVar212._12_4_ * fVar84 + auVar213._12_4_ * auVar9._12_4_;
      auVar92 = vsubps_avx(auVar92,auVar103);
      auVar9 = vandps_avx(local_428,auVar184);
      auVar184 = vshufps_avx(auVar9,auVar9,0xf5);
      auVar9 = vmaxss_avx(auVar184,auVar9);
    } while (fVar82 <= auVar9._0_4_);
    local_218 = auVar92._0_4_;
    if ((0.0 <= local_218) && (local_218 <= 1.0)) {
      auVar9 = vmovshdup_avx(auVar92);
      fVar84 = auVar9._0_4_;
      if ((0.0 <= fVar84) && (fVar84 <= 1.0)) {
        auVar9 = vinsertps_avx(ZEXT416((uint)(pLVar47->vx).field_0.m128[2]),
                               ZEXT416(*(uint *)((long)&(pLVar47->vy).field_0 + 8)),0x1c);
        auVar66 = vinsertps_avx(auVar9,ZEXT416(*(uint *)((long)&(pLVar47->vz).field_0 + 8)),0x28);
        auVar9 = vdpps_avx(auVar66,local_448,0x7f);
        auVar184 = vdpps_avx(auVar66,local_458,0x7f);
        auVar212 = vdpps_avx(auVar66,auVar63,0x7f);
        auVar213 = vdpps_avx(auVar66,auVar89,0x7f);
        auVar229 = vdpps_avx(auVar66,auVar62,0x7f);
        auVar250 = vdpps_avx(auVar66,auVar90,0x7f);
        auVar154 = vdpps_avx(auVar66,auVar122,0x7f);
        auVar66 = vdpps_avx(auVar66,auVar109,0x7f);
        fVar86 = 1.0 - fVar84;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar229._0_4_)),ZEXT416((uint)fVar86),
                                 auVar9);
        auVar184 = vfmadd231ss_fma(ZEXT416((uint)(auVar250._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                   auVar184);
        auVar212 = vfmadd231ss_fma(ZEXT416((uint)(auVar154._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                   auVar212);
        auVar226 = ZEXT1664(auVar212);
        auVar213 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar66._0_4_)),ZEXT416((uint)fVar86),
                                   auVar213);
        fVar83 = 1.0 - local_218;
        fVar84 = fVar83 * local_218 * local_218 * 3.0;
        fVar145 = local_218 * local_218 * local_218;
        auVar212 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ * fVar145)),ZEXT416((uint)fVar84),
                                   auVar212);
        fVar86 = local_218 * 3.0 * fVar83 * fVar83;
        auVar184 = vfmadd231ss_fma(auVar212,ZEXT416((uint)fVar86),auVar184);
        fVar121 = fVar83 * fVar83 * fVar83;
        auVar9 = vfmadd231ss_fma(auVar184,ZEXT416((uint)fVar121),auVar9);
        fVar85 = auVar9._0_4_;
        if ((fVar58 <= fVar85) && (fVar60 = *(float *)(ray + k * 4 + 0x80), fVar85 <= fVar60)) {
          pGVar5 = (context->scene->geometries).items[uVar53].ptr;
          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            bVar57 = false;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (bVar57 = true, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_208 = vshufps_avx(auVar92,auVar92,0x55);
            auVar205._8_4_ = 0x3f800000;
            auVar205._0_8_ = 0x3f8000003f800000;
            auVar205._12_4_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar205,local_208);
            fVar228 = local_208._0_4_;
            auVar224._0_4_ = fVar228 * (float)local_478._0_4_;
            fVar133 = local_208._4_4_;
            auVar224._4_4_ = fVar133 * (float)local_478._4_4_;
            fVar270 = local_208._8_4_;
            auVar224._8_4_ = fVar270 * fStack_470;
            fVar193 = local_208._12_4_;
            auVar224._12_4_ = fVar193 * fStack_46c;
            auVar240._0_4_ = fVar228 * (float)local_4b8._0_4_;
            auVar240._4_4_ = fVar133 * (float)local_4b8._4_4_;
            auVar240._8_4_ = fVar270 * fStack_4b0;
            auVar240._12_4_ = fVar193 * fStack_4ac;
            auVar245._0_4_ = fVar228 * (float)local_4c8._0_4_;
            auVar245._4_4_ = fVar133 * (float)local_4c8._4_4_;
            auVar245._8_4_ = fVar270 * fStack_4c0;
            auVar245._12_4_ = fVar193 * fStack_4bc;
            auVar254._0_4_ = fVar228 * fVar162;
            auVar254._4_4_ = fVar133 * fVar180;
            auVar254._8_4_ = fVar270 * fVar181;
            auVar254._12_4_ = fVar193 * fVar182;
            auVar184 = vfmadd231ps_fma(auVar224,auVar9,local_468);
            auVar212 = vfmadd231ps_fma(auVar240,auVar9,local_498);
            auVar213 = vfmadd231ps_fma(auVar245,auVar9,local_4a8);
            auVar229 = vfmadd231ps_fma(auVar254,auVar9,local_488);
            auVar9 = vsubps_avx(auVar212,auVar184);
            auVar184 = vsubps_avx(auVar213,auVar212);
            auVar226 = ZEXT1664(auVar184);
            auVar212 = vsubps_avx(auVar229,auVar213);
            auVar246._0_4_ = auVar184._0_4_ * local_218;
            auVar246._4_4_ = auVar184._4_4_ * local_218;
            auVar246._8_4_ = auVar184._8_4_ * local_218;
            auVar246._12_4_ = auVar184._12_4_ * local_218;
            auVar178._4_4_ = fVar83;
            auVar178._0_4_ = fVar83;
            auVar178._8_4_ = fVar83;
            auVar178._12_4_ = fVar83;
            auVar9 = vfmadd231ps_fma(auVar246,auVar178,auVar9);
            auVar206._0_4_ = auVar212._0_4_ * local_218;
            auVar206._4_4_ = auVar212._4_4_ * local_218;
            auVar206._8_4_ = auVar212._8_4_ * local_218;
            auVar206._12_4_ = auVar212._12_4_ * local_218;
            auVar212 = vfmadd231ps_fma(auVar206,auVar178,auVar184);
            auVar207._0_4_ = auVar212._0_4_ * local_218;
            auVar207._4_4_ = auVar212._4_4_ * local_218;
            auVar207._8_4_ = auVar212._8_4_ * local_218;
            auVar207._12_4_ = auVar212._12_4_ * local_218;
            auVar212 = vfmadd231ps_fma(auVar207,auVar178,auVar9);
            local_398 = auVar146._0_4_;
            fStack_394 = auVar146._4_4_;
            fStack_390 = auVar146._8_4_;
            fStack_38c = auVar146._12_4_;
            auVar160._0_4_ = fVar145 * local_398;
            auVar160._4_4_ = fVar145 * fStack_394;
            auVar160._8_4_ = fVar145 * fStack_390;
            auVar160._12_4_ = fVar145 * fStack_38c;
            auVar118._4_4_ = fVar84;
            auVar118._0_4_ = fVar84;
            auVar118._8_4_ = fVar84;
            auVar118._12_4_ = fVar84;
            auVar9 = vfmadd132ps_fma(auVar118,auVar160,auVar135);
            auVar142._4_4_ = fVar86;
            auVar142._0_4_ = fVar86;
            auVar142._8_4_ = fVar86;
            auVar142._12_4_ = fVar86;
            auVar9 = vfmadd132ps_fma(auVar142,auVar9,auVar88);
            auVar119._0_4_ = auVar212._0_4_ * 3.0;
            auVar119._4_4_ = auVar212._4_4_ * 3.0;
            auVar119._8_4_ = auVar212._8_4_ * 3.0;
            auVar119._12_4_ = auVar212._12_4_ * 3.0;
            auVar130._4_4_ = fVar121;
            auVar130._0_4_ = fVar121;
            auVar130._8_4_ = fVar121;
            auVar130._12_4_ = fVar121;
            auVar212 = vfmadd132ps_fma(auVar130,auVar9,auVar61);
            auVar9 = vshufps_avx(auVar119,auVar119,0xc9);
            auVar143._0_4_ = auVar212._0_4_ * auVar9._0_4_;
            auVar143._4_4_ = auVar212._4_4_ * auVar9._4_4_;
            auVar143._8_4_ = auVar212._8_4_ * auVar9._8_4_;
            auVar143._12_4_ = auVar212._12_4_ * auVar9._12_4_;
            auVar9 = vshufps_avx(auVar212,auVar212,0xc9);
            auVar212 = vfmsub231ps_fma(auVar143,auVar119,auVar9);
            auVar9 = vshufps_avx(auVar212,auVar212,0x55);
            local_248[0] = (RTCHitN)auVar9[0];
            local_248[1] = (RTCHitN)auVar9[1];
            local_248[2] = (RTCHitN)auVar9[2];
            local_248[3] = (RTCHitN)auVar9[3];
            local_248[4] = (RTCHitN)auVar9[4];
            local_248[5] = (RTCHitN)auVar9[5];
            local_248[6] = (RTCHitN)auVar9[6];
            local_248[7] = (RTCHitN)auVar9[7];
            local_248[8] = (RTCHitN)auVar9[8];
            local_248[9] = (RTCHitN)auVar9[9];
            local_248[10] = (RTCHitN)auVar9[10];
            local_248[0xb] = (RTCHitN)auVar9[0xb];
            local_248[0xc] = (RTCHitN)auVar9[0xc];
            local_248[0xd] = (RTCHitN)auVar9[0xd];
            local_248[0xe] = (RTCHitN)auVar9[0xe];
            local_248[0xf] = (RTCHitN)auVar9[0xf];
            local_238 = vshufps_avx(auVar212,auVar212,0xaa);
            local_228 = auVar212._0_4_;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            fStack_214 = local_218;
            fStack_210 = local_218;
            fStack_20c = local_218;
            local_1f8 = CONCAT44(uVar4,uVar4);
            uStack_1f0 = CONCAT44(uVar4,uVar4);
            local_1e8._4_4_ = uVar53;
            local_1e8._0_4_ = uVar53;
            local_1e8._8_4_ = uVar53;
            local_1e8._12_4_ = uVar53;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar85;
            local_538 = *local_520;
            args.valid = (int *)local_538;
            args.geometryUserPtr = pGVar5->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = local_248;
            args.N = 4;
            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar226 = ZEXT1664(auVar184);
              (*pGVar5->occlusionFilterN)(&args);
            }
            if (local_538 == (undefined1  [16])0x0) {
              auVar9 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar9 = auVar9 ^ _DAT_01f46b70;
            }
            else {
              p_Var6 = context->args->filter;
              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                auVar226 = ZEXT1664(auVar226._0_16_);
                (*p_Var6)(&args);
              }
              auVar184 = vpcmpeqd_avx(local_538,_DAT_01f45a50);
              auVar9 = auVar184 ^ _DAT_01f46b70;
              auVar120._8_4_ = 0xff800000;
              auVar120._0_8_ = 0xff800000ff800000;
              auVar120._12_4_ = 0xff800000;
              auVar184 = vblendvps_avx(auVar120,*(undefined1 (*) [16])(args.ray + 0x80),auVar184);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar184;
            }
            auVar104._8_8_ = 0x100000001;
            auVar104._0_8_ = 0x100000001;
            bVar57 = (auVar104 & auVar9) != (undefined1  [16])0x0;
            if (!bVar57) {
              *(float *)(ray + k * 4 + 0x80) = fVar60;
            }
          }
          bVar55 = (bool)(bVar55 | bVar57);
        }
      }
    }
    goto LAB_0110ac97;
  }
  auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar93,ZEXT416((uint)auVar110._0_4_),0x10);
  goto LAB_0110a6e9;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }